

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf_tests.cpp
# Opt level: O3

void __thiscall rbf_tests::rbf_helper_functions::test_method(rbf_helper_functions *this)

{
  pointer *this_00;
  _Rb_tree_header *__last1;
  vector<CTxOut,_std::allocator<CTxOut>_> *this_01;
  CTxMemPool *this_02;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pCVar3;
  size_type sVar4;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *phVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  void *pvVar11;
  undefined8 *puVar12;
  long *__n;
  _Atomic_word *p_Var13;
  uint256 *puVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  undefined1 uVar15;
  undefined1 uVar16;
  char cVar17;
  undefined1 uVar18;
  undefined7 uVar19;
  undefined7 uVar20;
  undefined7 uVar21;
  undefined7 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined7 uVar27;
  undefined7 uVar28;
  undefined7 uVar29;
  undefined7 uVar30;
  bool bVar31;
  int iVar32;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar33;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var34;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var35;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var36;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var37;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var38;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var39;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var40;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var41;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var42;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var43;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var44;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Var45;
  int64_t iVar46;
  pointer psVar47;
  uint uVar48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar49;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  *p_Var50;
  long lVar51;
  pointer pCVar52;
  ulong uVar53;
  char *pcVar54;
  iterator pvVar55;
  CMutableTransaction *pCVar56;
  CTxMemPool *pCVar57;
  iterator in_R9;
  iterator pvVar58;
  long in_FS_OFFSET;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<long> __l_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  initializer_list<long> __l_02;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_03;
  initializer_list<long> __l_04;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_05;
  initializer_list<long> __l_06;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_07;
  initializer_list<long> __l_08;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_09;
  initializer_list<long> __l_10;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_11;
  initializer_list<long> __l_12;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_13;
  initializer_list<long> __l_14;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_15;
  initializer_list<long> __l_16;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_17;
  initializer_list<long> __l_18;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_19;
  initializer_list<long> __l_20;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_21;
  initializer_list<long> __l_22;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_23;
  initializer_list<long> __l_24;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_25;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_26;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_27;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_28;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_29;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_30;
  const_string file_11;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_31;
  const_string file_12;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_32;
  const_string file_13;
  const_string file_14;
  initializer_list<transaction_identifier<false>_> __l_33;
  const_string file_15;
  initializer_list<transaction_identifier<false>_> __l_34;
  const_string file_16;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_35;
  initializer_list<transaction_identifier<false>_> __l_36;
  const_string file_17;
  initializer_list<transaction_identifier<false>_> __l_37;
  const_string file_18;
  initializer_list<transaction_identifier<false>_> __l_38;
  const_string file_19;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_39;
  initializer_list<transaction_identifier<false>_> __l_40;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_41;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_42;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_43;
  initializer_list<long> __l_44;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_45;
  initializer_list<long> __l_46;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_47;
  const_string file_44;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_48;
  initializer_list<long> __l_49;
  const_string file_45;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_50;
  const_string file_46;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_51;
  initializer_list<long> __l_52;
  const_string file_47;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_53;
  const_string file_48;
  const_string file_49;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_54;
  const_string file_50;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_55;
  const_string file_51;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_56;
  const_string file_52;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_57;
  const_string file_53;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_58;
  const_string file_54;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_59;
  const_string file_55;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_60;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_61;
  initializer_list<long> __l_62;
  const_string file_56;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_63;
  const_string file_57;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_64;
  const_string file_58;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_65;
  initializer_list<long> __l_66;
  const_string file_59;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_67;
  const_string file_60;
  initializer_list<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  __l_68;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar59;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar60;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar61;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar62;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar63;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar64;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar65;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar66;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar67;
  Span<unsigned_char> bytes;
  check_type cVar68;
  undefined1 *local_1168;
  undefined1 *local_1160;
  char *local_1158;
  char *local_1150;
  undefined1 local_1141 [25];
  char *local_1128;
  undefined1 *local_1120;
  undefined1 *local_1118;
  char *local_1110;
  char *local_1108;
  undefined1 *local_1100;
  undefined1 *local_10f8;
  char *local_10f0;
  char *local_10e8;
  undefined1 local_10d9 [25];
  char *local_10c0;
  CTransactionRef two_parent_child_tx;
  undefined1 *local_10a8;
  undefined1 *local_10a0;
  char *local_1098;
  char *local_1090;
  undefined1 *local_1088;
  undefined1 *local_1080;
  char *local_1078;
  char *local_1070;
  CTransactionRef grand_child_tx;
  char *local_1058;
  char *local_1050;
  undefined1 *local_1048;
  undefined1 *local_1040;
  char *local_1038;
  char *local_1030;
  char *local_1028;
  char *local_1020;
  undefined1 *local_1018;
  undefined1 *local_1010;
  char *local_1008;
  char *local_1000;
  CTransactionRef child_tx;
  char *local_fe8;
  char *local_fe0;
  undefined1 *local_fd8;
  undefined1 *local_fd0;
  char *local_fc8;
  char *local_fc0;
  char *local_fb8;
  char *local_fb0;
  undefined1 *local_fa8;
  undefined1 *local_fa0;
  char *local_f98;
  char *local_f90;
  CTransactionRef local_f88;
  char *local_f78;
  char *local_f70;
  undefined1 *local_f68;
  undefined1 *local_f60;
  char *local_f58;
  char *local_f50;
  undefined1 local_f48 [32];
  char *local_f28;
  char *local_f20;
  undefined1 *local_f18;
  undefined1 *local_f10;
  char *local_f08;
  char *local_f00;
  CTransactionRef spends_conflicting_confirmed;
  char *local_ee8;
  char *local_ee0;
  undefined1 *local_ed8;
  undefined1 *local_ed0;
  char *local_ec8;
  char *local_ec0;
  char *local_eb8;
  char *local_eb0;
  undefined1 *local_ea8;
  undefined1 *local_ea0;
  char *local_e98;
  char *local_e90;
  CTransactionRef spends_new_unconfirmed;
  char *local_e78;
  char *local_e70;
  undefined1 *local_e68;
  undefined1 *local_e60;
  char *local_e58;
  char *local_e50;
  char *local_e48;
  char *local_e40;
  undefined1 *local_e38;
  undefined1 *local_e30;
  char *local_e28;
  char *local_e20;
  char *local_e18;
  char *local_e10;
  undefined1 *local_e08;
  undefined1 *local_e00;
  char *local_df8;
  char *local_df0;
  char *local_de8;
  char *local_de0;
  undefined1 *local_dd8;
  undefined1 *local_dd0;
  char *local_dc8;
  char *local_dc0;
  CTransactionRef spends_unconfirmed;
  char *local_da8;
  char *local_da0;
  undefined1 *local_d98;
  undefined1 *local_d90;
  char *local_d88;
  char *local_d80;
  CTransactionRef local_d78;
  undefined1 *local_d68;
  undefined1 *local_d60;
  char *local_d58;
  char *local_d50;
  undefined1 *local_d48;
  undefined1 *local_d40;
  char *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  undefined1 *local_d18;
  undefined1 *local_d10;
  char *local_d08;
  char *local_d00;
  CTransactionRef local_cf8;
  undefined1 *local_ce8;
  undefined1 *local_ce0;
  char *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  char *local_ca8;
  char *local_ca0;
  CTransactionRef local_c98;
  undefined1 *local_c88;
  undefined1 *local_c80;
  char *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  undefined1 *local_c50;
  char *local_c48;
  char *local_c40;
  CTransactionRef local_c38;
  undefined1 *local_c28;
  undefined1 *local_c20;
  char *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  CTransactionRef local_bd8;
  size_type conflicts_size;
  char *local_bc0;
  char *local_bb8;
  undefined1 *local_bb0;
  undefined1 *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  undefined1 *local_b80;
  undefined1 *local_b78;
  char *local_b70;
  char *local_b68;
  CTransactionRef conflicts_with_parents;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  parent_inputs;
  char *local_b38;
  char *local_b30;
  undefined1 *local_b28;
  undefined1 *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  undefined1 *local_ac8;
  undefined1 *local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_aa0;
  undefined1 *local_a98;
  undefined1 *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  undefined1 *local_a68;
  undefined1 *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  undefined1 *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  undefined1 *local_9d8;
  undefined1 *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  undefined1 *local_948;
  undefined1 *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  char *local_920;
  undefined1 *local_918;
  undefined1 *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  CFeeRate local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  CFeeRate local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  CFeeRate local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  CFeeRate local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  CFeeRate local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  CFeeRate local_740;
  undefined1 *local_738;
  undefined1 *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  CFeeRate local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  CTransactionRef tx13;
  CTransactionRef tx12;
  CTransactionRef tx11;
  CTransactionRef tx10;
  CTransactionRef tx9;
  CTransactionRef tx8;
  CTransactionRef tx7;
  CTransactionRef tx6;
  CTransactionRef tx5;
  CTransactionRef tx4;
  CTransactionRef tx3;
  CTransactionRef tx2;
  CTransactionRef tx1;
  CAmount high_fee;
  CAmount normal_fee;
  CAmount low_fee;
  TestMemPoolEntryHelper entry;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [24];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_470;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_460;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_450;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_438;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_428;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Stack_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_418;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_408;
  duration local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_3e8;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  _Stack_3e0;
  undefined1 *apuStack_3d8 [2];
  setEntries all_conflicts;
  setEntries all_children;
  setEntries all_parents;
  uint256 unused_txid;
  setEntries empty_set;
  setEntries all_entries;
  setEntries set_78_high;
  setEntries set_56_low;
  setEntries set_34_cpfp;
  setEntries set_12_normal;
  CMutableTransaction tx1_1;
  element_type *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  TestMemPoolEntryHelper entry_1;
  CMutableTransaction tx2_1;
  undefined1 local_70 [8];
  CScriptWitness witness;
  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
  local_40;
  long local_38;
  
  local_1030 = (char *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar54 = "m_node.mempool";
  puVar33 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                      (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                       ,0x75,"test_method","m_node.mempool");
  this_02 = (puVar33->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device = &(this_02->cs).super_recursive_mutex;
  criticalblock2.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  low_fee = 10000;
  normal_fee = 100000;
  high_fee = 1000000;
  psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(psVar47->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(psVar47->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_refcount._M_pi;
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
      UNLOCK();
    }
    else {
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 1000000000;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_00,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx1,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx1);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
  if (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_01,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_02,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx2,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx2);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)psVar47[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)psVar47[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
      UNLOCK();
    }
    else {
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
    }
  }
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_03,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 0x418168c0;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_04,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx3,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx3);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
  if (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_05,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 999000000;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_06,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx4,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 1000000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx4);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)psVar47[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)psVar47[2].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
      UNLOCK();
    }
    else {
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
    }
  }
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_07,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 0x418168c0;
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_08,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx5,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx5);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
  if (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (tx5.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_09._M_len = 1;
  __l_09._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_09,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 0x41722680;
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_10,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx6,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 10000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx6);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0;
  tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._1_7_ = 0x5f5e1;
  CTxMemPool::PrioritiseTransaction
            (this_02,&((tx6.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->hash).m_wrapped,(CAmount *)&tx1_1);
  psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)psVar47[3].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)psVar47[3].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
      UNLOCK();
    }
    else {
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
    }
  }
  __l_11._M_len = 1;
  __l_11._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_11,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 999000000;
  __l_12._M_len = 1;
  __l_12._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_12,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx7,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 1000000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx7);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)psVar47[4].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)psVar47[4].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
      UNLOCK();
    }
    else {
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
    }
  }
  __l_13._M_len = 1;
  __l_13._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_13,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 999000000;
  __l_14._M_len = 1;
  __l_14._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_14,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx8,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 1000000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx8);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)psVar47[5].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)psVar47[5].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
      UNLOCK();
    }
    else {
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
    }
  }
  __l_15._M_len = 1;
  __l_15._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_15,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  __l_16._M_len = 1;
  __l_16._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_16,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx9,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx9);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)psVar47[6].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)psVar47[6].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
      UNLOCK();
    }
    else {
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
    }
  }
  __l_17._M_len = 1;
  __l_17._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_17,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  __l_18._M_len = 1;
  __l_18._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_18,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx10,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx10);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)psVar47[7].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)psVar47[7].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
      UNLOCK();
    }
    else {
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
    }
  }
  __l_19._M_len = 1;
  __l_19._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_19,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  __l_20._M_len = 1;
  __l_20._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_20,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx11,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx11);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)psVar47[8].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)psVar47[8].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
      UNLOCK();
    }
    else {
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
    }
  }
  __l_21._M_len = 1;
  __l_21._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_21,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  __l_22._M_len = 1;
  __l_22._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_22,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx12,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx12);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)psVar47[9].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
  tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)psVar47[9].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
      UNLOCK();
    }
    else {
      p_Var13 = (_Atomic_word *)
                ((long)&((tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish)->prevout).hash + 8);
      *p_Var13 = *p_Var13 + 1;
    }
  }
  __l_23._M_len = 1;
  __l_23._M_array = (iterator)&tx2_1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)&tx1_1,__l_23,(allocator_type *)&set_34_cpfp);
  set_12_normal._M_t._M_impl._0_8_ = 995000000;
  set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 995000000;
  set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  __l_24._M_len = 2;
  __l_24._M_array = (iterator)&set_12_normal;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&entry_1,__l_24,(allocator_type *)&set_56_low);
  make_tx((rbf_tests *)&tx13,
          (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
  if (entry_1.nFee != 0) {
    operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&tx1_1);
  if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  entry.nFee = 100000;
  TestMemPoolEntryHelper::FromTx((CTxMemPoolEntry *)&tx1_1,&entry,&tx13);
  CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&local_1b8);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._1_7_,
               tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._1_7_,
                        tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_));
  }
  oVar59 = CTxMemPool::GetIter(this_02,&((tx1.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->hash).m_wrapped);
  _Var34 = oVar59.
           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
           ._M_payload;
  if (((undefined1  [16])
       oVar59.
       super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
       ._M_payload.
       super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
      & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    oVar60 = CTxMemPool::GetIter(this_02,&((tx2.
                                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->hash).m_wrapped);
    _Var35 = oVar60.
             super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
             ._M_payload;
    if (((undefined1  [16])
         oVar60.
         super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
        & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      oVar61 = CTxMemPool::GetIter(this_02,&((tx3.
                                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->hash).m_wrapped);
      _Var36 = oVar61.
               super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
               ._M_payload;
      if (((undefined1  [16])
           oVar61.
           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
          & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        oVar62 = CTxMemPool::GetIter(this_02,&((tx4.
                                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->hash).m_wrapped);
        _Var37 = oVar62.
                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                 ._M_payload;
        if (((undefined1  [16])
             oVar62.
             super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
            & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          oVar63 = CTxMemPool::GetIter(this_02,&((tx5.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->hash).m_wrapped);
          _Var38 = oVar63.
                   super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                   ._M_payload;
          if (((undefined1  [16])
               oVar63.
               super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
              & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            oVar64 = CTxMemPool::GetIter(this_02,&((tx6.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
            _Var39 = oVar64.
                     super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                     ._M_payload;
            if (((undefined1  [16])
                 oVar64.
                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              oVar65 = CTxMemPool::GetIter(this_02,&((tx7.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
              _Var40 = oVar65.
                       super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                       ._M_payload;
              if (((undefined1  [16])
                   oVar65.
                   super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                  & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  std::__throw_bad_optional_access();
                }
              }
              else {
                oVar66 = CTxMemPool::GetIter(this_02,&((tx8.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                if (((undefined1  [16])
                     oVar66.
                     super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                    & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    std::__throw_bad_optional_access();
                  }
                }
                else {
                  oVar67 = CTxMemPool::GetIter(this_02,&((tx9.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                  _Var41 = oVar67.
                           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                           ._M_payload;
                  if (((undefined1  [16])
                       oVar67.
                       super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                      & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      std::__throw_bad_optional_access();
                    }
                  }
                  else {
                    oVar67 = CTxMemPool::GetIter(this_02,&((tx10.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                    _Var42 = oVar67.
                             super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                             ._M_payload;
                    if (((undefined1  [16])
                         oVar67.
                         super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                         ._M_payload.
                         super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                        & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        std::__throw_bad_optional_access();
                      }
                    }
                    else {
                      oVar67 = CTxMemPool::GetIter(this_02,&((tx11.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                      _Var43 = oVar67.
                               super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                               ._M_payload;
                      if (((undefined1  [16])
                           oVar67.
                           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                          & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                          std::__throw_bad_optional_access();
                        }
                      }
                      else {
                        oVar67 = CTxMemPool::GetIter(this_02,&((tx12.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                        _Var44 = oVar67.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload;
                        if (((undefined1  [16])
                             oVar67.
                             super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                            & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                            std::__throw_bad_optional_access();
                          }
                        }
                        else {
                          oVar67 = CTxMemPool::GetIter(this_02,&((tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                          _Var45 = oVar67.
                                   super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                   ._M_payload;
                          if (((undefined1  [16])
                               oVar67.
                               super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                              & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                              std::__throw_bad_optional_access();
                            }
                          }
                          else {
                            local_5f0 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_5e8 = "";
                            local_600 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
                            file.m_end = (iterator)0xb6;
                            file.m_begin = (iterator)&local_5f0;
                            msg.m_end = in_R9;
                            msg.m_begin = pcVar54;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
                                       (size_t)&local_600,msg);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            set_56_low._M_t._M_impl._0_8_ = _Var34.field2 + 0x70;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            set_34_cpfp._M_t._M_impl._0_8_ = anon_var_dwarf_12582f2;
                            set_34_cpfp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                 + 0x5b;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x28;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae4;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&set_56_low,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&set_56_low >> 8);
                            entry_1.m_sequence = (uint64_t)&set_78_high;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae428;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x2;
                            set_78_high._M_t._M_impl._0_8_ = &normal_fee;
                            set_12_normal._M_t._M_impl._0_1_ =
                                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(_Var34.field2 + 0x70))->_M_allocated_capacity == normal_fee;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&set_12_normal,(lazy_ostream *)&tx2_1,1,2
                                       ,REQUIRE,0xec2f25,(size_t)&set_34_cpfp,0xb6,&tx1_1,
                                       "normal_fee",&entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            local_610 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_608 = "";
                            local_620 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_618 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_00.m_end = (iterator)0xb7;
                            file_00.m_begin = (iterator)&local_610;
                            msg_00.m_end = pvVar58;
                            msg_00.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_00,(size_t)&local_620,msg_00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            set_56_low._M_t._M_impl._0_8_ = _Var35.field2 + 0x70;
                            set_12_normal._M_t._M_impl._0_1_ =
                                 *(long *)(_Var35.field2 + 0x70) == normal_fee;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            set_34_cpfp._M_t._M_impl._0_8_ = anon_var_dwarf_12582f2;
                            set_34_cpfp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                 + 0x5b;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x28;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae4;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&set_56_low,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&set_56_low >> 8);
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae428;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&set_78_high;
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x2;
                            set_78_high._M_t._M_impl._0_8_ = &normal_fee;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&set_12_normal,(lazy_ostream *)&tx2_1,1,2
                                       ,REQUIRE,0xec2f48,(size_t)&set_34_cpfp,0xb7,&tx1_1,
                                       "normal_fee",&entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            local_630 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_628 = "";
                            local_640 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_638 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_01.m_end = (iterator)0xb8;
                            file_01.m_begin = (iterator)&local_630;
                            msg_01.m_end = pvVar58;
                            msg_01.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_01,(size_t)&local_640,msg_01);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            set_56_low._M_t._M_impl._0_8_ = _Var36.field2 + 0x70;
                            set_12_normal._M_t._M_impl._0_1_ =
                                 *(long *)(_Var36.field2 + 0x70) == low_fee;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            set_34_cpfp._M_t._M_impl._0_8_ = anon_var_dwarf_12582f2;
                            set_34_cpfp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                 + 0x5b;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x28;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae4;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&set_56_low,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&set_56_low >> 8);
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae428;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&set_78_high;
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x2;
                            set_78_high._M_t._M_impl._0_8_ = &low_fee;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&set_12_normal,(lazy_ostream *)&tx2_1,1,2
                                       ,REQUIRE,0xec2f60,(size_t)&set_34_cpfp,0xb8,&tx1_1,"low_fee",
                                       &entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            local_650 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_648 = "";
                            local_660 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_658 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_02.m_end = (iterator)0xb9;
                            file_02.m_begin = (iterator)&local_650;
                            msg_02.m_end = pvVar58;
                            msg_02.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_02,(size_t)&local_660,msg_02);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            set_56_low._M_t._M_impl._0_8_ = _Var37.field2 + 0x70;
                            set_78_high._M_t._M_impl._0_8_ = &high_fee;
                            set_12_normal._M_t._M_impl._0_1_ =
                                 *(long *)(_Var37.field2 + 0x70) == high_fee;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            set_34_cpfp._M_t._M_impl._0_8_ = anon_var_dwarf_12582f2;
                            set_34_cpfp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                 + 0x5b;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x28;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae4;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&set_56_low,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&set_56_low >> 8);
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae428;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&set_78_high;
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x2;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&set_12_normal,(lazy_ostream *)&tx2_1,1,2
                                       ,REQUIRE,0xec2f75,(size_t)&set_34_cpfp,0xb9,&tx1_1,"high_fee"
                                       ,&entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            local_670 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_668 = "";
                            local_680 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_678 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_03.m_end = (iterator)0xba;
                            file_03.m_begin = (iterator)&local_670;
                            msg_03.m_end = pvVar58;
                            msg_03.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_03,(size_t)&local_680,msg_03);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            set_56_low._M_t._M_impl._0_8_ = _Var38.field2 + 0x70;
                            set_12_normal._M_t._M_impl._0_1_ =
                                 *(long *)(_Var38.field2 + 0x70) == low_fee;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            set_34_cpfp._M_t._M_impl._0_8_ = anon_var_dwarf_12582f2;
                            set_34_cpfp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                 + 0x5b;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x28;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae4;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&set_56_low,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&set_56_low >> 8);
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae428;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&set_78_high;
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x2;
                            set_78_high._M_t._M_impl._0_8_ = &low_fee;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&set_12_normal,(lazy_ostream *)&tx2_1,1,2
                                       ,REQUIRE,0xec2f94,(size_t)&set_34_cpfp,0xba,&tx1_1,"low_fee",
                                       &entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            local_690 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_688 = "";
                            local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_698 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_04.m_end = (iterator)0xbb;
                            file_04.m_begin = (iterator)&local_690;
                            msg_04.m_end = pvVar58;
                            msg_04.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_04,(size_t)&local_6a0,msg_04);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            set_56_low._M_t._M_impl._0_8_ = _Var39.field2 + 0x70;
                            set_12_normal._M_t._M_impl._0_1_ =
                                 *(long *)(_Var39.field2 + 0x70) == low_fee;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            set_34_cpfp._M_t._M_impl._0_8_ = anon_var_dwarf_12582f2;
                            set_34_cpfp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                 + 0x5b;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x28;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae4;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&set_56_low,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&set_56_low >> 8);
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae428;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&set_78_high;
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x2;
                            set_78_high._M_t._M_impl._0_8_ = &low_fee;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&set_12_normal,(lazy_ostream *)&tx2_1,1,2
                                       ,REQUIRE,0xec2fa9,(size_t)&set_34_cpfp,0xbb,&tx1_1,"low_fee",
                                       &entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            local_6b0 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_6a8 = "";
                            local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_05.m_end = (iterator)0xbc;
                            file_05.m_begin = (iterator)&local_6b0;
                            msg_05.m_end = pvVar58;
                            msg_05.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_05,(size_t)&local_6c0,msg_05);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            set_56_low._M_t._M_impl._0_8_ = _Var40.field2 + 0x70;
                            set_12_normal._M_t._M_impl._0_1_ =
                                 *(long *)(_Var40.field2 + 0x70) == high_fee;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            set_34_cpfp._M_t._M_impl._0_8_ = anon_var_dwarf_12582f2;
                            set_34_cpfp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                 + 0x5b;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x28;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae4;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&set_56_low,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&set_56_low >> 8);
                            set_78_high._M_t._M_impl._0_8_ = &high_fee;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae428;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&set_78_high;
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x2;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&set_12_normal,(lazy_ostream *)&tx2_1,1,2
                                       ,REQUIRE,0xec2fca,(size_t)&set_34_cpfp,0xbc,&tx1_1,"high_fee"
                                       ,&entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            local_6d0 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_6c8 = "";
                            local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_06.m_end = (iterator)0xbd;
                            file_06.m_begin = (iterator)&local_6d0;
                            msg_06.m_end = pvVar58;
                            msg_06.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_06,(size_t)&local_6e0,msg_06);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            set_56_low._M_t._M_impl._0_8_ =
                                 oVar66.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload.field2 + 0x70;
                            set_12_normal._M_t._M_impl._0_1_ =
                                 *(long *)(oVar66.
                                           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                           ._M_payload.
                                           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                           ._M_payload.field2 + 0x70) == high_fee;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            set_34_cpfp._M_t._M_impl._0_8_ = anon_var_dwarf_12582f2;
                            set_34_cpfp._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                 + 0x5b;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 0x28;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae4;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&set_56_low,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&set_56_low >> 8);
                            set_78_high._M_t._M_impl._0_8_ = &high_fee;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae428;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&set_78_high;
                            pvVar55 = (iterator)0x2;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&set_12_normal,(lazy_ostream *)&tx2_1,1,2
                                       ,REQUIRE,0xec2fe0,(size_t)&set_34_cpfp,0xbd,&tx1_1,"high_fee"
                                       ,&entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &set_12_normal._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ =
                                 oVar59.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar15 = (char)tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 oVar59.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar19 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ =
                                 oVar60.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar23 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_1_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 oVar60.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar27 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._1_7_;
                            __l_25._M_len = 2;
                            __l_25._M_array = (iterator)&tx1_1;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&set_12_normal,__l_25,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)&tx2_1);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ =
                                 oVar61.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar16 = (char)tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 oVar61.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar20 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ =
                                 oVar62.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar24 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_1_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 oVar62.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar28 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._1_7_;
                            __l_26._M_len = 2;
                            __l_26._M_array = (iterator)&tx1_1;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&set_34_cpfp,__l_26,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)&tx2_1);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ =
                                 oVar63.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            cVar17 = (char)tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 oVar63.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar21 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ =
                                 oVar64.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar25 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_1_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 oVar64.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar29 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._1_7_;
                            __l_27._M_len = 2;
                            __l_27._M_array = (iterator)&tx1_1;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&set_56_low,__l_27,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)&tx2_1);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ =
                                 oVar65.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar18 = (char)tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 oVar65.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar22 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ =
                                 oVar66.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._0_1_;
                            uVar26 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._0_1_;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 oVar66.
                                 super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                 ._M_payload._1_7_;
                            uVar30 = tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._1_7_;
                            __l_28._M_len = 2;
                            __l_28._M_array = (iterator)&tx1_1;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&set_78_high,__l_28,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)&tx2_1);
                            pCVar56 = &tx2_1;
                            __l_29._M_len = 8;
                            __l_29._M_array = (iterator)&tx1_1;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = uVar15;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = uVar19;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = uVar23;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ = uVar27;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = uVar16;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = uVar20;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = uVar24;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = uVar28;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = cVar17;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ = uVar21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)_Var39;
                            tx1_1._48_8_ = _Var40;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&all_entries,__l_29,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)pCVar56);
                            empty_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 &empty_set._M_t._M_impl.super__Rb_tree_header._M_header;
                            empty_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
                            ;
                            empty_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            empty_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[1] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[2] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[3] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[4] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[5] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[6] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[7] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[8] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[9] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[10] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
                            unused_txid.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
                            bytes.m_size = 0x20;
                            bytes.m_data = (uchar *)&unused_txid;
                            empty_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                                 empty_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                            GetRandBytes(bytes);
                            local_6f0 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_6e8 = "";
                            local_700 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_07.m_end = (iterator)0xcd;
                            file_07.m_begin = (iterator)&local_6f0;
                            msg_07.m_end = pvVar55;
                            msg_07.m_begin = (iterator)pCVar56;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_07,(size_t)&local_700,msg_07);
                            all_children._M_t._M_impl._0_8_ =
                                 (long)&(((((_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                             *)(_Var34.field2 + 0xa8))->_M_value).node)->
                                        super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                        ).
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                        .
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                        .
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                        .
                                        super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                        .super_pod_value_holder<CTxMemPoolEntry> + 1;
                            iVar46 = GetVirtualTransactionSize
                                               ((long)*(int *)(_Var34.field2 + 0x78),
                                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)(_Var34.field2 + 0xa0))->_M_allocated_capacity,
                                                nBytesPerSigOp);
                            CFeeRate::CFeeRate(&local_708,(CAmount *)&all_children,(int)iVar46 + 2);
                            _cVar68 = 0x533152;
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,&set_12_normal,local_708,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125f9ed;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts( set_12_normal, CFeeRate(entry1_normal->GetModifiedFee() + 1, entry1_normal->GetTxSize() + 2), unused_txid).has_value()"
                                 + 0x8d;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_718 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_710 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_718,0xcd);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_728 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_720 = "";
                            local_738 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_730 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_08.m_end = (iterator)0xcf;
                            file_08.m_begin = (iterator)&local_728;
                            msg_08.m_end = pvVar58;
                            msg_08.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_08,(size_t)&local_738,msg_08);
                            all_children._M_t._M_impl._0_8_ =
                                 (((_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                    *)(_Var34.field2 + 0xa8))->_M_value).node;
                            iVar46 = GetVirtualTransactionSize
                                               ((long)*(int *)(_Var34.field2 + 0x78),
                                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)(_Var34.field2 + 0xa0))->_M_allocated_capacity,
                                                nBytesPerSigOp);
                            CFeeRate::CFeeRate(&local_740,(CAmount *)&all_children,(uint32_t)iVar46)
                            ;
                            _cVar68 = 0x5332bd;
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,&set_12_normal,local_740,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fa03;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts(set_12_normal, CFeeRate(entry1_normal->GetModifiedFee(), entry1_normal->GetTxSize()), unused_txid).has_value()"
                                 + 0x84;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_750 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_748 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_750,0xcf);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_760 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_758 = "";
                            local_770 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_768 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_09.m_end = (iterator)0xd0;
                            file_09.m_begin = (iterator)&local_760;
                            msg_09.m_end = pvVar58;
                            msg_09.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_09,(size_t)&local_770,msg_09);
                            all_children._M_t._M_impl._0_8_ =
                                 (long)&(((((_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                             *)(_Var34.field2 + 0xa8))->_M_value).node)->
                                        super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                        ).
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                        .
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                        .
                                        super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                        .
                                        super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                        .super_pod_value_holder<CTxMemPoolEntry> + 1;
                            iVar46 = GetVirtualTransactionSize
                                               ((long)*(int *)(_Var34.field2 + 0x78),
                                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)(_Var34.field2 + 0xa0))->_M_allocated_capacity,
                                                nBytesPerSigOp);
                            CFeeRate::CFeeRate(&local_778,(CAmount *)&all_children,(uint32_t)iVar46)
                            ;
                            _cVar68 = 0x53342f;
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,&set_12_normal,local_778,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fa19;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts(set_12_normal, CFeeRate(entry1_normal->GetModifiedFee() + 1, entry1_normal->GetTxSize()), unused_txid) == std::nullopt"
                                 + 0x8c;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_788 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_780 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_788,0xd0);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_798 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_790 = "";
                            local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_10.m_end = (iterator)0xd2;
                            file_10.m_begin = (iterator)&local_798;
                            msg_10.m_end = pvVar58;
                            msg_10.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_10,(size_t)&local_7a8,msg_10);
                            __l_30._M_len = 1;
                            __l_30._M_array = (iterator)&all_conflicts;
                            all_conflicts._M_t._M_impl._0_8_ = _Var38;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_30,(CompareIteratorByHash *)&local_3e8._M_value,
                                  (allocator_type *)&local_408._M_value);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)(*(long *)(_Var38.field2 + 0xa8) + 1);
                            iVar46 = GetVirtualTransactionSize
                                               ((long)*(int *)(_Var38.field2 + 0x78),
                                                *(int64_t *)(_Var38.field2 + 0xa0),nBytesPerSigOp);
                            CFeeRate::CFeeRate(&local_7b0,(CAmount *)&witness,(uint32_t)iVar46);
                            _cVar68 = 0x5335d4;
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,(setEntries *)&tx1_1,local_7b0,&unused_txid);
                            all_parents._M_t._M_impl._0_8_ =
                                 CONCAT71(all_parents._M_t._M_impl._1_7_,entry_1.spendsCoinbase) ^ 1
                            ;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_children._M_t._M_impl._0_8_ = anon_var_dwarf_125fa2f;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts({entry5_low}, CFeeRate(entry5_low->GetModifiedFee() + 1, entry5_low->GetTxSize()), unused_txid) == std::nullopt"
                                 + 0x85;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            local_7c0 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_7b8 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&all_children;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_parents,(lazy_ostream *)&tx2_1,1,0,
                                       WARN,_cVar68,(size_t)&local_7c0,0xd2);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_parents._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            if (entry_1.spendsCoinbase == true) {
                              entry_1.spendsCoinbase = false;
                              if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                              }
                            }
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_7d0 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_7c8 = "";
                            local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_11.m_end = (iterator)0xd3;
                            file_11.m_begin = (iterator)&local_7d0;
                            msg_11.m_end = pvVar58;
                            msg_11.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_11,(size_t)&local_7e0,msg_11);
                            __l_31._M_len = 1;
                            __l_31._M_array = (iterator)&all_conflicts;
                            all_conflicts._M_t._M_impl._0_8_ = _Var39;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_31,(CompareIteratorByHash *)&local_3e8._M_value,
                                  (allocator_type *)&local_408._M_value);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)(*(long *)(_Var39.field2 + 0x70) + 1);
                            iVar46 = GetVirtualTransactionSize
                                               ((long)*(int *)(_Var39.field2 + 0x78),
                                                *(int64_t *)(_Var39.field2 + 0xa0),nBytesPerSigOp);
                            CFeeRate::CFeeRate(&local_7e8,(CAmount *)&witness,(uint32_t)iVar46);
                            _cVar68 = 0x533774;
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,(setEntries *)&tx1_1,local_7e8,&unused_txid);
                            all_parents._M_t._M_impl._0_1_ = entry_1.spendsCoinbase;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_children._M_t._M_impl._0_8_ = anon_var_dwarf_125fa45;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts({entry6_low_prioritised}, CFeeRate(entry6_low_prioritised->GetFee() + 1, entry6_low_prioritised->GetTxSize()), unused_txid).has_value()"
                                 + 0x9d;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            local_7f8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_7f0 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&all_children;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_parents,(lazy_ostream *)&tx2_1,1,0,
                                       WARN,_cVar68,(size_t)&local_7f8,0xd3);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_parents._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            if (entry_1.spendsCoinbase == true) {
                              entry_1.spendsCoinbase = false;
                              if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                              }
                            }
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_808 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_800 = "";
                            local_818 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_810 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_12.m_end = (iterator)0xd4;
                            file_12.m_begin = (iterator)&local_808;
                            msg_12.m_end = pvVar58;
                            msg_12.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_12,(size_t)&local_818,msg_12);
                            __l_32._M_len = 1;
                            __l_32._M_array = (iterator)&all_conflicts;
                            all_conflicts._M_t._M_impl._0_8_ = _Var39;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_32,(CompareIteratorByHash *)&local_3e8._M_value,
                                  (allocator_type *)&local_408._M_value);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)(*(long *)(_Var39.field2 + 0xa8) + 1);
                            iVar46 = GetVirtualTransactionSize
                                               ((long)*(int *)(_Var39.field2 + 0x78),
                                                *(int64_t *)(_Var39.field2 + 0xa0),nBytesPerSigOp);
                            CFeeRate::CFeeRate(&local_820,(CAmount *)&witness,(uint32_t)iVar46);
                            _cVar68 = 0x533912;
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,(setEntries *)&tx1_1,local_820,&unused_txid);
                            all_parents._M_t._M_impl._0_8_ =
                                 CONCAT71(all_parents._M_t._M_impl._1_7_,entry_1.spendsCoinbase) ^ 1
                            ;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_children._M_t._M_impl._0_8_ = anon_var_dwarf_125fa5b;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts({entry6_low_prioritised}, CFeeRate(entry6_low_prioritised->GetModifiedFee() + 1, entry6_low_prioritised->GetTxSize()), unused_txid) == std::nullopt"
                                 + 0xa9;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            local_830 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_828 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&all_children;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_parents,(lazy_ostream *)&tx2_1,1,0,
                                       WARN,_cVar68,(size_t)&local_830,0xd4);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_parents._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            if (entry_1.spendsCoinbase == true) {
                              entry_1.spendsCoinbase = false;
                              if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                              }
                            }
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_840 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_838 = "";
                            local_850 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_848 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_13.m_end = (iterator)0xd8;
                            file_13.m_begin = (iterator)&local_840;
                            msg_13.m_end = pvVar58;
                            msg_13.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_13,(size_t)&local_850,msg_13);
                            all_children._M_t._M_impl._0_8_ = *(long *)(_Var37.field2 + 0xa8);
                            iVar46 = GetVirtualTransactionSize
                                               ((long)*(int *)(_Var37.field2 + 0x78),
                                                *(int64_t *)(_Var37.field2 + 0xa0),nBytesPerSigOp);
                            CFeeRate::CFeeRate(&local_858,(CAmount *)&all_children,(uint32_t)iVar46)
                            ;
                            _cVar68 = 0x533a92;
                            PaysMoreThanConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,&set_34_cpfp,local_858,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fa71;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysMoreThanConflicts(set_34_cpfp, CFeeRate(entry4_high->GetModifiedFee(), entry4_high->GetTxSize()), unused_txid).has_value()"
                                 + 0x7e;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_868 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_860 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_868,0xd8);
                            this_00 = &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage;
                            boost::detail::shared_count::~shared_count((shared_count *)this_00);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_878 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_870 = "";
                            local_888 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_880 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_14.m_end = (iterator)0xdb;
                            file_14.m_begin = (iterator)&local_878;
                            msg_14.m_end = pvVar58;
                            msg_14.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_14,(size_t)&local_888,msg_14);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  ((tx1.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_33._M_len = 1;
                            __l_33._M_array = (iterator)&tx2_1;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&tx1_1,__l_33,(less<transaction_identifier<false>_> *)&witness,
                                  (allocator_type *)&local_3e8._M_value);
                            _cVar68 = 0x533c05;
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,&empty_set,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&tx1_1,&unused_txid);
                            all_children._M_t._M_impl._0_8_ =
                                 CONCAT71(all_children._M_t._M_impl._1_7_,entry_1.spendsCoinbase) ^
                                 1;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_conflicts._M_t._M_impl._0_8_ = anon_var_dwarf_125fa87;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "EntriesAndTxidsDisjoint(empty_set, {tx1->GetHash()}, unused_txid) == std::nullopt"
                                 + 0x51;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae1c8;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_898 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_890 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&all_conflicts;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_children,
                                       (lazy_ostream *)&all_parents,1,0,WARN,_cVar68,
                                       (size_t)&local_898,0xdb);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_children._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            if (entry_1.spendsCoinbase == true) {
                              entry_1.spendsCoinbase = false;
                              if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                              }
                            }
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&tx1_1);
                            local_8a8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_8a0 = "";
                            local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_15.m_end = (iterator)0xdc;
                            file_15.m_begin = (iterator)&local_8a8;
                            msg_15.m_end = pvVar58;
                            msg_15.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_15,(size_t)&local_8b8,msg_15);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  ((tx3.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 *(pointer *)
                                  (((tx3.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 *(pointer *)
                                  (((tx3.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  (((tx3.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_34._M_len = 1;
                            __l_34._M_array = (iterator)&tx2_1;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&tx1_1,__l_34,(less<transaction_identifier<false>_> *)&witness,
                                  (allocator_type *)&local_3e8._M_value);
                            _cVar68 = 0x533d7f;
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,&set_12_normal,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&tx1_1,&unused_txid);
                            all_children._M_t._M_impl._0_8_ =
                                 CONCAT71(all_children._M_t._M_impl._1_7_,entry_1.spendsCoinbase) ^
                                 1;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_conflicts._M_t._M_impl._0_8_ = anon_var_dwarf_125fa9d;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "EntriesAndTxidsDisjoint(set_12_normal, {tx3->GetHash()}, unused_txid) == std::nullopt"
                                 + 0x55;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae1c8;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_8c8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_8c0 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&all_conflicts;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_children,
                                       (lazy_ostream *)&all_parents,1,0,WARN,_cVar68,
                                       (size_t)&local_8c8,0xdc);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_children._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            if (entry_1.spendsCoinbase == true) {
                              entry_1.spendsCoinbase = false;
                              if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                              }
                            }
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&tx1_1);
                            local_8d8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_8d0 = "";
                            local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_16.m_end = (iterator)0xdd;
                            file_16.m_begin = (iterator)&local_8d8;
                            msg_16.m_end = pvVar58;
                            msg_16.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_16,(size_t)&local_8e8,msg_16);
                            __l_35._M_len = 1;
                            __l_35._M_array = (iterator)&local_3e8;
                            local_3e8 = _Var35;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_35,(CompareIteratorByHash *)&local_408._M_value,
                                  (allocator_type *)&local_428._M_value);
                            puVar14 = &((tx2.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->hash).m_wrapped;
                            all_parents._M_t._M_impl._0_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[0];
                            all_parents._M_t._M_impl._1_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[1];
                            all_parents._M_t._M_impl._2_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[2];
                            all_parents._M_t._M_impl._3_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[3];
                            all_parents._M_t._M_impl._4_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[4];
                            all_parents._M_t._M_impl._5_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[5];
                            all_parents._M_t._M_impl._6_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[6];
                            all_parents._M_t._M_impl._7_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[7];
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 *(undefined8 *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 *(_Base_ptr *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 *(_Base_ptr *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_36._M_len = 1;
                            __l_36._M_array = (iterator)&all_parents;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&entry_1,__l_36,
                                  (less<transaction_identifier<false>_> *)&local_448._M_value,
                                  (allocator_type *)&local_470._M_value);
                            _cVar68 = 0x533f2f;
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx2_1,(setEntries *)&tx1_1,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&entry_1,&unused_txid);
                            all_conflicts._M_t._M_impl._0_1_ =
                                 (char)tx2_1.vout.
                                       super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                       super__Vector_impl_data._M_finish;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_125fab3;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec34de;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae1c8;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_8f8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_8f0 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&witness;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_conflicts,
                                       (lazy_ostream *)&all_children,1,0,WARN,_cVar68,
                                       (size_t)&local_8f8,0xdd);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            if ((char)tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_start != (pointer)this_00) {
                                operator_delete(tx2_1.vin.
                                                super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                _M_impl.super__Vector_impl_data._M_start,
                                                (ulong)(((tx2_1.vin.
                                                                                                                    
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ->prevout).hash.m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 1));
                              }
                            }
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&entry_1);
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_908 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_900 = "";
                            local_918 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_910 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_17.m_end = (iterator)0xde;
                            file_17.m_begin = (iterator)&local_908;
                            msg_17.m_end = pvVar58;
                            msg_17.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_17,(size_t)&local_918,msg_17);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  ((tx1.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_37._M_len = 1;
                            __l_37._M_array = (iterator)&tx2_1;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&tx1_1,__l_37,(less<transaction_identifier<false>_> *)&witness,
                                  (allocator_type *)&local_3e8._M_value);
                            _cVar68 = 0x5340b8;
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,&set_12_normal,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&tx1_1,&unused_txid);
                            all_children._M_t._M_impl._0_1_ = entry_1.spendsCoinbase;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_conflicts._M_t._M_impl._0_8_ = anon_var_dwarf_125fac9;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "EntriesAndTxidsDisjoint(set_12_normal, {tx1->GetHash()}, unused_txid).has_value()"
                                 + 0x51;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae1c8;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_928 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_920 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&all_conflicts;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_children,
                                       (lazy_ostream *)&all_parents,1,0,WARN,_cVar68,
                                       (size_t)&local_928,0xde);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_children._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            if (entry_1.spendsCoinbase == true) {
                              entry_1.spendsCoinbase = false;
                              if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                              }
                            }
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&tx1_1);
                            local_938 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_930 = "";
                            local_948 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_940 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_18.m_end = (iterator)0xdf;
                            file_18.m_begin = (iterator)&local_938;
                            msg_18.m_end = pvVar58;
                            msg_18.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_18,(size_t)&local_948,msg_18);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  ((tx2.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 *(pointer *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 *(pointer *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 *(pointer *)
                                  (((tx2.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_38._M_len = 1;
                            __l_38._M_array = (iterator)&tx2_1;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&tx1_1,__l_38,(less<transaction_identifier<false>_> *)&witness,
                                  (allocator_type *)&local_3e8._M_value);
                            _cVar68 = 0x534230;
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,&set_12_normal,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&tx1_1,&unused_txid);
                            all_children._M_t._M_impl._0_1_ = entry_1.spendsCoinbase;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_conflicts._M_t._M_impl._0_8_ = anon_var_dwarf_125fad3;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "EntriesAndTxidsDisjoint(set_12_normal, {tx2->GetHash()}, unused_txid).has_value()"
                                 + 0x51;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_parents._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae1c8;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_958 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_950 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&all_conflicts;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_children,
                                       (lazy_ostream *)&all_parents,1,0,WARN,_cVar68,
                                       (size_t)&local_958,0xdf);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_children._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            if (entry_1.spendsCoinbase == true) {
                              entry_1.spendsCoinbase = false;
                              if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                              }
                            }
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&tx1_1);
                            local_968 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_960 = "";
                            local_978 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_970 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_19.m_end = (iterator)0xe2;
                            file_19.m_begin = (iterator)&local_968;
                            msg_19.m_end = pvVar58;
                            msg_19.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_19,(size_t)&local_978,msg_19);
                            __l_39._M_len = 1;
                            __l_39._M_array = (iterator)&local_3e8;
                            local_3e8 = _Var35;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_39,(CompareIteratorByHash *)&local_408._M_value,
                                  (allocator_type *)&local_428._M_value);
                            puVar14 = &((tx1.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->hash).m_wrapped;
                            all_parents._M_t._M_impl._0_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[0];
                            all_parents._M_t._M_impl._1_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[1];
                            all_parents._M_t._M_impl._2_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[2];
                            all_parents._M_t._M_impl._3_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[3];
                            all_parents._M_t._M_impl._4_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[4];
                            all_parents._M_t._M_impl._5_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[5];
                            all_parents._M_t._M_impl._6_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[6];
                            all_parents._M_t._M_impl._7_1_ =
                                 (puVar14->super_base_blob<256U>).m_data._M_elems[7];
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 *(undefined8 *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 8);
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 *(_Base_ptr *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x10);
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 *(_Base_ptr *)
                                  (((tx1.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                                  + 0x18);
                            __l_40._M_len = 1;
                            __l_40._M_array = (iterator)&all_parents;
                            std::
                            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                   *)&entry_1,__l_40,
                                  (less<transaction_identifier<false>_> *)&local_448._M_value,
                                  (allocator_type *)&local_470._M_value);
                            _cVar68 = 0x5343e5;
                            EntriesAndTxidsDisjoint_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx2_1,(setEntries *)&tx1_1,
                                       (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                        *)&entry_1,&unused_txid);
                            all_conflicts._M_t._M_impl._0_8_ =
                                 CONCAT71(all_conflicts._M_t._M_impl._1_7_,
                                          (char)tx2_1.vout.
                                                super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                                _M_impl.super__Vector_impl_data._M_finish) ^ 1;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                 _S_red;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_125fadd;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec35da;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffffffffff00;
                            all_children._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ae1c8;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                            local_988 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_980 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            all_children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 (_Base_ptr)&witness;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&all_conflicts,
                                       (lazy_ostream *)&all_children,1,0,WARN,_cVar68,
                                       (size_t)&local_988,0xe2);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_parent);
                            if ((char)tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_start != (pointer)this_00) {
                                operator_delete(tx2_1.vin.
                                                super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                _M_impl.super__Vector_impl_data._M_start,
                                                (ulong)(((tx2_1.vin.
                                                                                                                    
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ->prevout).hash.m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 1));
                              }
                            }
                            std::
                            _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                            ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                                         *)&entry_1);
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_998 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_990 = "";
                            local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_20.m_end = (iterator)0xed;
                            file_20.m_begin = (iterator)&local_998;
                            msg_20.m_end = pvVar58;
                            msg_20.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_20,(size_t)&local_9a8,msg_20);
                            _cVar68 = 0x534528;
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,1000000,1,(CFeeRate)0x0,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fb08;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF( high_fee, high_fee, 1, CFeeRate(0), unused_txid) == std::nullopt"
                                 + 0x4c;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_9b8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_9b0 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_9b8,0xed);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_9c8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_9c0 = "";
                            local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_21.m_end = (iterator)0xee;
                            file_21.m_begin = (iterator)&local_9c8;
                            msg_21.m_end = pvVar58;
                            msg_21.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_21,(size_t)&local_9d8,msg_21);
                            _cVar68 = 0x534654;
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,999999,1,(CFeeRate)0x0,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fb1e;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee, high_fee - 1, 1, CFeeRate(0), unused_txid).has_value()"
                                 + 0x4b;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_9e8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_9e0 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_9e8,0xee);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_9f8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_9f0 = "";
                            local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_22.m_end = (iterator)0xef;
                            file_22.m_begin = (iterator)&local_9f8;
                            msg_22.m_end = pvVar58;
                            msg_22.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_22,(size_t)&local_a08,msg_22);
                            _cVar68 = 0x53477e;
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,0xf4241,1000000,1,(CFeeRate)0x0,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fb34;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee + 1, high_fee, 1, CFeeRate(0), unused_txid).has_value()"
                                 + 0x4b;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_a18 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a10 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_a18,0xef);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_a28 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a20 = "";
                            local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_23.m_end = (iterator)0xf1;
                            file_23.m_begin = (iterator)&local_a28;
                            msg_23.m_end = pvVar58;
                            msg_23.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_23,(size_t)&local_a38,msg_23);
                            _cVar68 = 0x5348ab;
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,0xf4241,2,(CFeeRate)0x3e8,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fb3e;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee, high_fee + 1, 2, incremental_relay_feerate, unused_txid).has_value()"
                                 + 0x59;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_a48 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a40 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_a48,0xf1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_a58 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a50 = "";
                            local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_24.m_end = (iterator)0xf2;
                            file_24.m_begin = (iterator)&local_a58;
                            msg_24.m_end = pvVar58;
                            msg_24.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_24,(size_t)&local_a68,msg_24);
                            _cVar68 = 0x5349d8;
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,0xf4242,2,(CFeeRate)0x3e8,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fb54;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee, high_fee + 2, 2, incremental_relay_feerate, unused_txid) == std::nullopt"
                                 + 0x5d;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_a78 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a70 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_a78,0xf2);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_a88 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_a80 = "";
                            local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_25.m_end = (iterator)0xf3;
                            file_25.m_begin = (iterator)&local_a88;
                            msg_25.m_end = pvVar58;
                            msg_25.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_25,(size_t)&local_a98,msg_25);
                            _cVar68 = 0x534b07;
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,0xf4242,2,(CFeeRate)0x7d0,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fb6a;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee, high_fee + 2, 2, higher_relay_feerate, unused_txid).has_value()"
                                 + 0x54;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_aa8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_aa0 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_aa8,0xf3);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_ab8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ab0 = "";
                            local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_ac0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_26.m_end = (iterator)0xf4;
                            file_26.m_begin = (iterator)&local_ab8;
                            msg_26.m_end = pvVar58;
                            msg_26.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_26,(size_t)&local_ac8,msg_26);
                            _cVar68 = 0x534c34;
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,1000000,0xf4244,2,(CFeeRate)0x7d0,&unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fb80;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(high_fee, high_fee + 4, 2, higher_relay_feerate, unused_txid) == std::nullopt"
                                 + 0x58;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_ad8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ad0 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_ad8,0xf4);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_ae8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ae0 = "";
                            local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_27.m_end = (iterator)0xf5;
                            file_27.m_begin = (iterator)&local_ae8;
                            msg_27.m_end = pvVar58;
                            msg_27.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_27,(size_t)&local_af8,msg_27);
                            _cVar68 = 0x534d63;
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,10000,1000000,99999999,(CFeeRate)0x3e8,&unused_txid
                                      );
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fb96;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(low_fee, high_fee, 99999999, incremental_relay_feerate, unused_txid).has_value()"
                                 + 0x5b;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_b08 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_b00 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_b08,0xf5);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_b18 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_b10 = "";
                            local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_b20 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_28.m_end = (iterator)0xf6;
                            file_28.m_begin = (iterator)&local_b18;
                            msg_28.m_end = pvVar58;
                            msg_28.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_28,(size_t)&local_b28,msg_28);
                            _cVar68 = 0x534e90;
                            PaysForRBF_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,10000,100999999,99999999,(CFeeRate)0x3e8,
                                       &unused_txid);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            all_parents._M_t._M_impl._0_8_ = anon_var_dwarf_125fba0;
                            all_parents._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 (long)
                                 "PaysForRBF(low_fee, high_fee + 99999999, 99999999, incremental_relay_feerate, unused_txid) == std::nullopt"
                                 + 0x6a;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_b38 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_b30 = "";
                            pvVar55 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&all_parents;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_b38,0xf6);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = 0;
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            __l_41._M_len = 5;
                            __l_41._M_array = (iterator)&tx1_1;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = uVar15;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = uVar19;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = uVar16;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ = uVar20;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = cVar17;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = uVar21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = uVar18;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = uVar22;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = uVar26;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ = uVar30;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&all_parents,__l_41,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)&tx2_1);
                            pCVar56 = &tx2_1;
                            __l_42._M_len = 3;
                            __l_42._M_array = (iterator)&tx1_1;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = uVar23;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = uVar27;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = uVar24;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ = uVar28;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = uVar25;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = uVar29;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set(&all_children,__l_42,(CompareIteratorByHash *)&entry_1,
                                  (allocator_type *)pCVar56);
                            psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
                                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            peVar1 = (psVar47->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = (char)peVar1;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)peVar1 >> 8);
                            p_Var2 = (psVar47->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_refcount._M_pi;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = SUB81(p_Var2,0);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 (undefined7)((ulong)p_Var2 >> 8);
                            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                UNLOCK();
                                psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                              }
                              else {
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                              }
                            }
                            peVar1 = psVar47[1].
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = (char)peVar1;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ =
                                 (undefined7)((ulong)peVar1 >> 8);
                            p_Var2 = psVar47[1].
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(p_Var2,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)p_Var2 >> 8);
                            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                UNLOCK();
                                psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                              }
                              else {
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                              }
                            }
                            peVar1 = psVar47[2].
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = (char)peVar1;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 (undefined7)((ulong)peVar1 >> 8);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)psVar47[2].
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi;
                            if (tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                *(int *)&((tx1_1.vout.
                                           super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         scriptPubKey).super_CScriptBase._union =
                                     *(int *)&((tx1_1.vout.
                                                super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                              scriptPubKey).super_CScriptBase._union + 1;
                                UNLOCK();
                                psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                              }
                              else {
                                *(int *)&((tx1_1.vout.
                                           super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         scriptPubKey).super_CScriptBase._union =
                                     *(int *)&((tx1_1.vout.
                                                super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                              scriptPubKey).super_CScriptBase._union + 1;
                              }
                            }
                            tx1_1._48_8_ = psVar47[3].
                                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr;
                            p_Var2 = psVar47[3].
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                UNLOCK();
                                psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                              }
                              else {
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                              }
                            }
                            local_1b8 = psVar47[4].
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr;
                            local_1b0 = psVar47[4].
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi;
                            if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
                              }
                            }
                            __l_43._M_len = 5;
                            __l_43._M_array = (iterator)&tx1_1;
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::vector(&parent_inputs,__l_43,(allocator_type *)&entry_1);
                            lVar51 = 0x50;
                            do {
                              p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                        ((long)&set_12_normal._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count + lVar51);
                              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (p_Var2);
                              }
                              lVar51 = lVar51 + -0x10;
                            } while (lVar51 != 0);
                            entry_1.nFee = 50000000;
                            __l_44._M_len = 1;
                            __l_44._M_array = &entry_1.nFee;
                            std::vector<long,_std::allocator<long>_>::vector
                                      ((vector<long,_std::allocator<long>_> *)&tx1_1,__l_44,
                                       (allocator_type *)&tx2_1);
                            make_tx((rbf_tests *)&conflicts_with_parents,&parent_inputs,
                                    (vector<long,_std::allocator<long>_> *)&tx1_1);
                            pvVar11 = (void *)CONCAT71(tx1_1.vin.
                                                                                                              
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                            if (pvVar11 != (void *)0x0) {
                              operator_delete(pvVar11,CONCAT71(tx1_1.vin.
                                                                                                                              
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  - (long)pvVar11);
                            }
                            __last1 = &all_conflicts._M_t._M_impl.super__Rb_tree_header;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                                 all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                                 0xffffffff00000000;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                 (_Base_ptr)0x0;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                            local_b70 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_b68 = "";
                            local_b80 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_29.m_end = (iterator)0x102;
                            file_29.m_begin = (iterator)&local_b70;
                            msg_29.m_end = pvVar55;
                            msg_29.m_begin = (iterator)pCVar56;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                 &__last1->_M_header;
                            all_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                                 &__last1->_M_header;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_29,(size_t)&local_b80,msg_29);
                            _cVar68 = 0x535240;
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_02,&all_parents,&all_conflicts);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_125fbb6;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec3955;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_b90 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_b88 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&witness;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_b90,0x102);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_ba0 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_b98 = "";
                            local_bb0 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_ba8 = &boost::unit_test::basic_cstring<char_const>::null;
                            _cVar68 = 0x535348;
                            file_30.m_end = (iterator)0x103;
                            file_30.m_begin = (iterator)&local_ba0;
                            msg_30.m_end = pvVar58;
                            msg_30.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_30,(size_t)&local_bb0,msg_30);
                            if (all_conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                                all_entries._M_t._M_impl.super__Rb_tree_header._M_node_count) {
                              _cVar68 = 0x535372;
                              bVar31 = std::__equal<false>::
                                       equal<std::_Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>,std::_Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                                                 ((
                                                  _Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  )all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                                   _M_header._M_left,
                                                  (
                                                  _Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  )__last1,(
                                                  _Rb_tree_const_iterator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  )all_entries._M_t._M_impl.super__Rb_tree_header.
                                                   _M_header._M_left);
                            }
                            else {
                              bVar31 = false;
                            }
                            entry_1.nFee = CONCAT71(entry_1.nFee._1_7_,bVar31);
                            entry_1.time.__d.__r = (duration)0;
                            entry_1.nHeight = 0;
                            entry_1._20_4_ = 0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_125fbcc;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0xec3972;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 200;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae1;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&tx2_1,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&tx2_1 >> 8);
                            local_bc0 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_bb8 = "";
                            pvVar55 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&entry_1,(lazy_ostream *)&tx1_1,1,0,WARN,
                                       _cVar68,(size_t)&local_bc0,0x103);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)&entry_1.nHeight);
                            conflicts_size =
                                 all_conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count;
                            std::_Rb_tree<$270907ca$>::clear(&all_conflicts._M_t);
                            pCVar57 = this_02;
                            add_descendants(&local_bd8,
                                            (int32_t)tx2.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,
                                            (CTxMemPool *)
                                            tx2.
                                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi);
                            if (local_bd8.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_bd8.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                            }
                            local_be8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_be0 = "";
                            local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_31.m_end = (iterator)0x108;
                            file_31.m_begin = (iterator)&local_be8;
                            msg_31.m_end = pvVar55;
                            msg_31.m_begin = (iterator)pCVar57;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_31,(size_t)&local_bf8,msg_31);
                            _cVar68 = 0x5354c8;
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_02,&all_parents,&all_conflicts);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_125fbe4;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec39da;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_c08 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_c00 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&witness;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_c08,0x108);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            conflicts_size = conflicts_size + 0x17;
                            local_c18 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_c10 = "";
                            local_c28 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_32.m_end = (iterator)0x10a;
                            file_32.m_begin = (iterator)&local_c18;
                            msg_32.m_end = pvVar58;
                            msg_32.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_32,(size_t)&local_c28,msg_32);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            local_448 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(witness.stack.
                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count == conflicts_size);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3e8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xec2eb4;
                            _Stack_3e0 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                          )0xec2f0f;
                            local_408.field2 = &local_448;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 200;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&local_408,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&local_408 >> 8);
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae0c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_428;
                            pvVar55 = (iterator)0x2;
                            local_428.field2 = &conflicts_size;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,2,
                                       REQUIRE,0xec39db,(size_t)&local_3e8,0x10a,&tx1_1,
                                       "conflicts_size",&entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &witness.stack.
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::_Rb_tree<$270907ca$>::clear(&all_conflicts._M_t);
                            pCVar57 = this_02;
                            add_descendants(&local_c38,
                                            (int32_t)tx4.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,
                                            (CTxMemPool *)
                                            tx4.
                                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi);
                            if (local_c38.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_c38.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                            }
                            local_c48 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_c40 = "";
                            local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_33.m_end = (iterator)0x10e;
                            file_33.m_begin = (iterator)&local_c48;
                            msg_33.m_end = pvVar55;
                            msg_33.m_begin = (iterator)pCVar57;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_33,(size_t)&local_c58,msg_33);
                            _cVar68 = 0x5357cd;
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_02,&all_parents,&all_conflicts);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_125fbe4;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec39da;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_c68 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_c60 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&witness;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_c68,0x10e);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            conflicts_size = conflicts_size + 0x17;
                            local_c78 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_c70 = "";
                            local_c88 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_34.m_end = (iterator)0x110;
                            file_34.m_begin = (iterator)&local_c78;
                            msg_34.m_end = pvVar58;
                            msg_34.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_34,(size_t)&local_c88,msg_34);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(witness.stack.
                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count == conflicts_size);
                            local_448 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3e8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xec2eb4;
                            _Stack_3e0 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                          )0xec2f0f;
                            local_408.field2 = &local_448;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 200;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&local_408,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&local_408 >> 8);
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae0c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_428;
                            pvVar55 = (iterator)0x2;
                            local_428.field2 = &conflicts_size;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,2,
                                       REQUIRE,0xec39db,(size_t)&local_3e8,0x110,&tx1_1,
                                       "conflicts_size",&entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &witness.stack.
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::_Rb_tree<$270907ca$>::clear(&all_conflicts._M_t);
                            pCVar57 = this_02;
                            add_descendants(&local_c98,
                                            (int32_t)tx6.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,
                                            (CTxMemPool *)
                                            tx6.
                                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi);
                            if (local_c98.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_c98.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                            }
                            local_ca8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ca0 = "";
                            local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_35.m_end = (iterator)0x114;
                            file_35.m_begin = (iterator)&local_ca8;
                            msg_35.m_end = pvVar55;
                            msg_35.m_begin = (iterator)pCVar57;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_35,(size_t)&local_cb8,msg_35);
                            _cVar68 = 0x535acf;
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_02,&all_parents,&all_conflicts);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_125fbe4;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec39da;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_cc8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_cc0 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&witness;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_cc8,0x114);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            conflicts_size = conflicts_size + 0x17;
                            local_cd8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_cd0 = "";
                            local_ce8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_ce0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_36.m_end = (iterator)0x116;
                            file_36.m_begin = (iterator)&local_cd8;
                            msg_36.m_end = pvVar58;
                            msg_36.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_36,(size_t)&local_ce8,msg_36);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(witness.stack.
                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count == conflicts_size);
                            local_448 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3e8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xec2eb4;
                            _Stack_3e0 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                          )0xec2f0f;
                            local_408.field2 = &local_448;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 200;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&local_408,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&local_408 >> 8);
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae0c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_428;
                            pvVar55 = (iterator)0x2;
                            local_428.field2 = &conflicts_size;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,2,
                                       REQUIRE,0xec39db,(size_t)&local_3e8,0x116,&tx1_1,
                                       "conflicts_size",&entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &witness.stack.
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::_Rb_tree<$270907ca$>::clear(&all_conflicts._M_t);
                            pCVar57 = this_02;
                            add_descendants(&local_cf8,
                                            (int32_t)tx7.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,
                                            (CTxMemPool *)
                                            tx7.
                                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi);
                            if (local_cf8.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_cf8.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                            }
                            local_d08 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_d00 = "";
                            local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_37.m_end = (iterator)0x11a;
                            file_37.m_begin = (iterator)&local_d08;
                            msg_37.m_end = pvVar55;
                            msg_37.m_begin = (iterator)pCVar57;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_37,(size_t)&local_d18,msg_37);
                            _cVar68 = 0x535dd0;
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_02,&all_parents,&all_conflicts);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_125fbe4;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec39da;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_d28 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_d20 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&witness;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_d28,0x11a);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            conflicts_size = conflicts_size + 0x17;
                            local_d38 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_d30 = "";
                            local_d48 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_38.m_end = (iterator)0x11c;
                            file_38.m_begin = (iterator)&local_d38;
                            msg_38.m_end = pvVar58;
                            msg_38.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_38,(size_t)&local_d48,msg_38);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(witness.stack.
                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count == conflicts_size);
                            local_448 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3e8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xec2eb4;
                            _Stack_3e0 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                          )0xec2f0f;
                            local_408.field2 = &local_448;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 200;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&local_408,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&local_408 >> 8);
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae0c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_428;
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x2;
                            local_428.field2 = &conflicts_size;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,2,
                                       REQUIRE,0xec39db,(size_t)&local_3e8,0x11c,&tx1_1,
                                       "conflicts_size",&entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &witness.stack.
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            local_d58 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_d50 = "";
                            local_d68 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_d60 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_39.m_end = (iterator)0x11d;
                            file_39.m_begin = (iterator)&local_d58;
                            msg_39.m_end = pvVar58;
                            msg_39.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_39,(size_t)&local_d68,msg_39);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae088;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)0xf73bdc;
                            local_448 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count;
                            local_470._0_4_ = 100;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(witness.stack.
                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  all_conflicts._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count == 100);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3e8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xec2eb4;
                            _Stack_3e0 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                          )0xec2f0f;
                            local_408.field2 = &local_448;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = 0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = 200;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ = 0x13ae0;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ = 0x13c21;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(&local_408,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)&local_408 >> 8);
                            local_428.field2 = &local_470;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae248;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&local_428;
                            pvVar55 = (iterator)0x2;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,2,
                                       REQUIRE,0xec39db,(size_t)&local_3e8,0x11d,&tx1_1,"100",
                                       &entry_1);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &witness.stack.
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            std::_Rb_tree<$270907ca$>::clear(&all_conflicts._M_t);
                            pCVar57 = this_02;
                            add_descendants(&local_d78,
                                            (int32_t)tx8.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,
                                            (CTxMemPool *)
                                            tx8.
                                            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi);
                            if (local_d78.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_d78.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                            }
                            local_d88 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_d80 = "";
                            local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_40.m_end = (iterator)0x122;
                            file_40.m_begin = (iterator)&local_d88;
                            msg_40.m_end = pvVar55;
                            msg_40.m_begin = (iterator)pCVar57;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_40,(size_t)&local_d98,msg_40);
                            _cVar68 = 0x53623f;
                            GetEntriesForConflicts_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       conflicts_with_parents.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_02,&all_parents,&all_conflicts);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_125fc20;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec3a62;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_da8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_da0 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&witness;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_da8,0x122);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)tx1.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)tx1.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi;
                            if (tx1.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                (tx1.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (tx1.
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                (tx1.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (tx1.
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                              }
                            }
                            __l_45._M_len = 1;
                            __l_45._M_array = (iterator)&tx2_1;
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      *)&tx1_1,__l_45,(allocator_type *)&local_3e8._M_value);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2255100;
                            __l_46._M_len = 1;
                            __l_46._M_array = (iterator)&witness;
                            std::vector<long,_std::allocator<long>_>::vector
                                      ((vector<long,_std::allocator<long>_> *)&entry_1,__l_46,
                                       (allocator_type *)&local_408._M_value);
                            make_tx((rbf_tests *)&spends_unconfirmed,
                                    (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     *)&tx1_1,(vector<long,_std::allocator<long>_> *)&entry_1);
                            if (entry_1.nFee != 0) {
                              operator_delete((void *)entry_1.nFee,entry_1._16_8_ - entry_1.nFee);
                            }
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       *)&tx1_1);
                            if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_finish != (pointer)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
                            }
                            pCVar52 = ((spends_unconfirmed.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start;
                            pCVar3 = ((spends_unconfirmed.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->vin).
                                     super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                            if (pCVar52 != pCVar3) {
                              do {
                                local_dc8 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                ;
                                local_dc0 = "";
                                local_dd8 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
                                file_41.m_end = (iterator)0x128;
                                file_41.m_begin = (iterator)&local_dc8;
                                msg_41.m_end = pvVar58;
                                msg_41.m_begin = pvVar55;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           file_41,(size_t)&local_dd8,msg_41);
                                tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start._0_1_ = 0;
                                uVar7 = *(undefined8 *)
                                         (pCVar52->prevout).hash.m_wrapped.super_base_blob<256U>.
                                         m_data._M_elems;
                                uVar8 = *(undefined8 *)
                                         ((pCVar52->prevout).hash.m_wrapped.super_base_blob<256U>.
                                          m_data._M_elems + 8);
                                uVar9 = *(undefined8 *)
                                         ((pCVar52->prevout).hash.m_wrapped.super_base_blob<256U>.
                                          m_data._M_elems + 0x10);
                                uVar10 = *(undefined8 *)
                                          ((pCVar52->prevout).hash.m_wrapped.super_base_blob<256U>.
                                           m_data._M_elems + 0x18);
                                tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._1_7_ = (undefined7)uVar9;
                                tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_1_ =
                                     (undefined1)((ulong)uVar9 >> 0x38);
                                tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_ = (undefined7)uVar10;
                                tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_1_ =
                                     (char)((ulong)uVar10 >> 0x38);
                                tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start._1_7_ = (undefined7)uVar7;
                                tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_1_ =
                                     (undefined1)((ulong)uVar7 >> 0x38);
                                tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_finish._1_7_ = (undefined7)uVar8;
                                tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._0_1_ =
                                     (char)((ulong)uVar8 >> 0x38);
                                _cVar68 = 0x5364b0;
                                bVar31 = CTxMemPool::exists(this_02,(GenTxid *)&tx1_1);
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start =
                                     (pointer)CONCAT71(tx2_1.vin.
                                                                                                              
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  bVar31);
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_finish = (pointer)0x0;
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start =
                                     (pointer)anon_var_dwarf_125fc38;
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec3a91;
                                entry_1.time.__d.__r =
                                     (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                                entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                                entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                                entry_1.m_sequence = (uint64_t)&witness;
                                local_de8 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                ;
                                local_de0 = "";
                                pvVar55 = (iterator)0x1;
                                pvVar58 = (iterator)0x0;
                                boost::test_tools::tt_detail::report_assertion
                                          ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,
                                           WARN,_cVar68,(size_t)&local_de8,0x128);
                                boost::detail::shared_count::~shared_count
                                          ((shared_count *)
                                           &tx2_1.vin.
                                            super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                                pCVar52 = pCVar52 + 1;
                              } while (pCVar52 != pCVar3);
                            }
                            local_df8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_df0 = "";
                            local_e08 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_e00 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_42.m_end = (iterator)0x12c;
                            file_42.m_begin = (iterator)&local_df8;
                            msg_42.m_end = pvVar58;
                            msg_42.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_42,(size_t)&local_e08,msg_42);
                            _cVar68 = 0x5365e2;
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       spends_unconfirmed.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_02,&all_entries);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vout.
                                                                                                                
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) ^ 1);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_125fc50;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec3ae4;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            entry_1.m_sequence = (uint64_t)&witness;
                            local_e18 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_e10 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_e18,300);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            local_e28 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_e20 = "";
                            local_e38 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_e30 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_43.m_end = (iterator)0x12d;
                            file_43.m_begin = (iterator)&local_e28;
                            msg_43.m_end = pvVar58;
                            msg_43.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_43,(size_t)&local_e38,msg_43);
                            peVar1 = spends_unconfirmed.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            __l_47._M_len = 1;
                            __l_47._M_array = (iterator)&local_408;
                            local_408 = _Var35;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_47,(CompareIteratorByHash *)&local_428._M_value,
                                  (allocator_type *)&local_448._M_value);
                            _cVar68 = 0x536744;
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,peVar1,this_02,(setEntries *)&tx1_1);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(witness.stack.
                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  entry_1.spendsCoinbase) ^ 1);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3e8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xec3ae5;
                            _Stack_3e0 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                          )0xec3b3a;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&local_3e8;
                            local_e48 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_e40 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,0,WARN,
                                       _cVar68,(size_t)&local_e48,0x12d);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &witness.stack.
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            if (entry_1.spendsCoinbase == true) {
                              entry_1.spendsCoinbase = false;
                              if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                              }
                            }
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_e58 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_e50 = "";
                            local_e68 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_e60 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_44.m_end = (iterator)0x12e;
                            file_44.m_begin = (iterator)&local_e58;
                            msg_44.m_end = pvVar58;
                            msg_44.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_44,(size_t)&local_e68,msg_44);
                            _cVar68 = 0x536881;
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       spends_unconfirmed.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_02,&empty_set);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_125fc74;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec3b86;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_e78 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_e70 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&witness;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_e78,0x12e);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ =
                                 (char)tx1.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)
                                 ((ulong)tx1.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr >> 8);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ =
                                 SUB81(tx1.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi,0);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 (undefined7)
                                 ((ulong)tx1.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi >> 8);
                            if (tx1.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                (tx1.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (tx1.
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                (tx1.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (tx1.
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                              }
                            }
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ =
                                 (char)tx8.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ =
                                 (undefined7)
                                 ((ulong)tx8.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr >> 8);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ =
                                 SUB81(tx8.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)
                                 ((ulong)tx8.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi >> 8);
                            if (tx8.
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                (tx8.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (tx8.
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                (tx8.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_M_use_count =
                                     (tx8.
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                              }
                            }
                            __l_48._M_len = 2;
                            __l_48._M_array = (iterator)&tx1_1;
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      *)&entry_1,__l_48,(allocator_type *)&local_3e8._M_value);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2255100;
                            __l_49._M_len = 1;
                            __l_49._M_array = (iterator)&witness;
                            std::vector<long,_std::allocator<long>_>::vector
                                      ((vector<long,_std::allocator<long>_> *)&tx2_1,__l_49,
                                       (allocator_type *)&local_408._M_value);
                            make_tx((rbf_tests *)&spends_new_unconfirmed,
                                    (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     *)&entry_1,(vector<long,_std::allocator<long>_> *)&tx2_1);
                            if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(tx2_1.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_start,
                                              (long)tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)tx2_1.vin.
                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                            }
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       *)&entry_1);
                            lVar51 = 0x20;
                            do {
                              p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                        ((long)&set_12_normal._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count + lVar51);
                              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (p_Var2);
                              }
                              lVar51 = lVar51 + -0x10;
                            } while (lVar51 != 0);
                            local_e98 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_e90 = "";
                            local_ea8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_ea0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_45.m_end = (iterator)0x131;
                            file_45.m_begin = (iterator)&local_e98;
                            msg_45.m_end = pvVar58;
                            msg_45.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_45,(size_t)&local_ea8,msg_45);
                            peVar1 = spends_new_unconfirmed.
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            __l_50._M_len = 1;
                            __l_50._M_array = (iterator)&local_408;
                            local_408 = _Var35;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_50,(CompareIteratorByHash *)&local_428._M_value,
                                  (allocator_type *)&local_448._M_value);
                            _cVar68 = 0x536aff;
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,peVar1,this_02,(setEntries *)&tx1_1);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(witness.stack.
                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  entry_1.spendsCoinbase);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_3e8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xec3b87;
                            _Stack_3e0 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                          )0xec3bdc;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            local_eb8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_eb0 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&local_3e8;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,0,WARN,
                                       _cVar68,(size_t)&local_eb8,0x131);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &witness.stack.
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            if (entry_1.spendsCoinbase == true) {
                              entry_1.spendsCoinbase = false;
                              if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                              }
                            }
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_ec8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ec0 = "";
                            local_ed8 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_ed0 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_46.m_end = (iterator)0x132;
                            file_46.m_begin = (iterator)&local_ec8;
                            msg_46.m_end = pvVar58;
                            msg_46.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_46,(size_t)&local_ed8,msg_46);
                            _cVar68 = 0x536c32;
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,
                                       spends_new_unconfirmed.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_02,&all_entries);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start =
                                 (pointer)CONCAT71(tx2_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                   (char)tx1_1.vout.
                                                                                                                  
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish = (pointer)0x0;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)anon_var_dwarf_125fc8c;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xec3c2e;
                            entry_1.time.__d.__r =
                                 (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                            entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae1c8;
                            entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                            local_ee8 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_ee0 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            entry_1.m_sequence = (uint64_t)&witness;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&tx2_1,(lazy_ostream *)&entry_1,1,0,WARN,
                                       _cVar68,(size_t)&local_ee8,0x132);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
                              tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_finish._0_1_ = '\0';
                              if ((pointer *)
                                  CONCAT71(tx1_1.vin.
                                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                           .super__Vector_impl_data._M_start._1_7_,
                                           (char)tx1_1.vin.
                                                 super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) !=
                                  &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete((undefined1 *)
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                + 1);
                              }
                            }
                            psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
                                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            peVar1 = (psVar47->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = (char)peVar1;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)peVar1 >> 8);
                            p_Var2 = (psVar47->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_refcount._M_pi;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_1_ = SUB81(p_Var2,0);
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish._1_7_ =
                                 (undefined7)((ulong)p_Var2 >> 8);
                            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                UNLOCK();
                                psVar47 = (this->super_TestChain100Setup).m_coinbase_txns.
                                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                              }
                              else {
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                              }
                            }
                            peVar1 = psVar47[1].
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_1_ = (char)peVar1;
                            tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._1_7_ =
                                 (undefined7)((ulong)peVar1 >> 8);
                            p_Var2 = psVar47[1].
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._0_1_ = SUB81(p_Var2,0);
                            tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start._1_7_ =
                                 (undefined7)((ulong)p_Var2 >> 8);
                            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                              }
                            }
                            __l_51._M_len = 2;
                            __l_51._M_array = (iterator)&tx1_1;
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      *)&entry_1,__l_51,(allocator_type *)&local_3e8._M_value);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2aea540;
                            __l_52._M_len = 1;
                            __l_52._M_array = (iterator)&witness;
                            std::vector<long,_std::allocator<long>_>::vector
                                      ((vector<long,_std::allocator<long>_> *)&tx2_1,__l_52,
                                       (allocator_type *)&local_408._M_value);
                            make_tx((rbf_tests *)&spends_conflicting_confirmed,
                                    (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     *)&entry_1,(vector<long,_std::allocator<long>_> *)&tx2_1);
                            if (tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(tx2_1.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_start,
                                              (long)tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)tx2_1.vin.
                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                            }
                            std::
                            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       *)&entry_1);
                            lVar51 = 0x20;
                            do {
                              p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                        ((long)&set_12_normal._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count + lVar51);
                              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (p_Var2);
                              }
                              lVar51 = lVar51 + -0x10;
                            } while (lVar51 != 0);
                            local_f08 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_f00 = "";
                            local_f18 = &boost::unit_test::basic_cstring<char_const>::null;
                            local_f10 = &boost::unit_test::basic_cstring<char_const>::null;
                            file_47.m_end = (iterator)0x135;
                            file_47.m_begin = (iterator)&local_f08;
                            msg_47.m_end = pvVar58;
                            msg_47.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_47,(size_t)&local_f18,msg_47);
                            __l_53._M_len = 2;
                            __l_53._M_array = (iterator)&local_3e8;
                            local_3e8 = _Var34;
                            _Stack_3e0 = _Var36;
                            std::
                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                   *)&tx1_1,__l_53,(CompareIteratorByHash *)&local_428._M_value,
                                  (allocator_type *)&local_448._M_value);
                            _cVar68 = 0x536ec0;
                            HasNoNewUnconfirmed_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&entry_1,
                                       spends_conflicting_confirmed.
                                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,this_02,(setEntries *)&tx1_1);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)(CONCAT71(witness.stack.
                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  entry_1.spendsCoinbase) ^ 1);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            local_408 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                         )0xec3c2f;
                            local_400.__r = 0xec3c9a;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
                            tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            local_f28 = 
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_f20 = "";
                            pvVar55 = (iterator)0x1;
                            pvVar58 = (iterator)0x0;
                            tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                            super__Vector_impl_data._M_start = (pointer)&local_408;
                            boost::test_tools::tt_detail::report_assertion
                                      ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,0,WARN,
                                       _cVar68,(size_t)&local_f28,0x135);
                            boost::detail::shared_count::~shared_count
                                      ((shared_count *)
                                       &witness.stack.
                                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            if (entry_1.spendsCoinbase == true) {
                              entry_1.spendsCoinbase = false;
                              if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                              }
                            }
                            std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                            local_f48._16_8_ =
                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                            ;
                            local_f48._24_8_ =
                                 (long)
                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                 + 0x5b;
                            pbVar49 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_f48;
                            local_f48._0_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                            local_f48._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
                            file_48.m_end = (iterator)0x13a;
                            file_48.m_begin = local_f48 + 0x10;
                            msg_48.m_end = pvVar58;
                            msg_48.m_begin = pvVar55;
                            boost::unit_test::unit_test_log_t::set_checkpoint
                                      (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                       file_48,(size_t)pbVar49,msg_48);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish =
                                 (pointer)((ulong)witness.stack.
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish &
                                          0xffffffffffffff00);
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)&PTR__lazy_ostream_013ae088;
                            witness.stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                 (pointer)boost::unit_test::lazy_ostream::inst;
                            CTxMemPool::CheckConflictTopology_abi_cxx11_
                                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&tx1_1,this_02,&set_34_cpfp);
                            if ((char)tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_finish == '\0') {
                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                std::__throw_bad_optional_access();
                              }
                            }
                            else {
                              lVar51 = *(long *)_Var37;
                              p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                        (_Var37.field2 + 8);
                              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                }
                              }
                              base_blob<256u>::ToString_abi_cxx11_
                                        ((string *)&local_408._M_value,(void *)(lVar51 + 0x39));
                              tinyformat::format<std::__cxx11::string>
                                        ((string *)&local_3e8._M_value,
                                         (tinyformat *)"%s has 23 descendants, max 1 allowed",
                                         (char *)&local_408,pbVar49);
                              __n = (long *)CONCAT71(tx1_1.vin.
                                                                                                          
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                                  tx1_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._0_1_);
                              if (__n == (long *)_Stack_3e0.field2) {
                                if (__n == (long *)0x0) {
                                  bVar31 = true;
                                }
                                else {
                                  iVar32 = bcmp((void *)CONCAT71(tx1_1.vin.
                                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                (void *)local_3e8,(size_t)__n);
                                  bVar31 = iVar32 == 0;
                                }
                              }
                              else {
                                bVar31 = false;
                              }
                              local_428._0_1_ = bVar31;
                              _Stack_420 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                            )0x0;
                              aStack_418._M_allocated_capacity = 0;
                              local_448 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                           )0xec2eb4;
                              _Stack_440._M_pi =
                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xec2f0f;
                              entry_1.time.__d.__r =
                                   (duration)((ulong)entry_1.time.__d.__r & 0xffffffffffffff00);
                              entry_1.nFee = (CAmount)&PTR__lazy_ostream_013ae148;
                              entry_1._16_8_ = boost::unit_test::lazy_ostream::inst;
                              entry_1.m_sequence = (uint64_t)&local_470;
                              tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_start = (pointer)local_4a8;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_finish =
                                   (pointer)((ulong)tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                            0xffffffffffffff00);
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start =
                                   (pointer)&PTR__lazy_ostream_013ae148;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage =
                                   (pointer)boost::unit_test::lazy_ostream::inst;
                              pvVar55 = (iterator)0x1;
                              pvVar58 = (iterator)0x2;
                              local_4a8._0_8_ = &local_3e8;
                              local_470.field2 = &tx1_1;
                              boost::test_tools::tt_detail::report_assertion
                                        ((assertion_result *)&local_428._M_value,
                                         (lazy_ostream *)&witness,1,2,REQUIRE,0xec3c9b,
                                         (size_t)&local_448,0x13a,&entry_1,
                                         "tfm::format(\"%s has 23 descendants, max 1 allowed\", entry4_high->GetSharedTx()->GetHash().ToString())"
                                         ,&tx2_1);
                              boost::detail::shared_count::~shared_count
                                        ((shared_count *)&aStack_418._M_allocated_capacity);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_3e8.field2 !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)apuStack_3d8) {
                                operator_delete((void *)local_3e8,(ulong)((long)apuStack_3d8[0] + 1)
                                               );
                              }
                              if ((undefined1 **)local_408.field2 != &local_3f8) {
                                operator_delete((void *)local_408,(ulong)(local_3f8 + 1));
                              }
                              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (p_Var2);
                              }
                              if ((char)tx1_1.vout.
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish == '\x01') {
                                tx1_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
                                if ((pointer *)
                                    CONCAT71(tx1_1.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                                             (char)tx1_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_start) !=
                                    &tx1_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                  operator_delete((undefined1 *)
                                                  CONCAT71(tx1_1.vin.
                                                                                                                      
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start),
                                                  CONCAT71(tx1_1.vin.
                                                                                                                      
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  + 1);
                                }
                              }
                              local_f58 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_f50 = "";
                              local_f68 = &boost::unit_test::basic_cstring<char_const>::null;
                              local_f60 = &boost::unit_test::basic_cstring<char_const>::null;
                              file_49.m_end = (iterator)0x13d;
                              file_49.m_begin = (iterator)&local_f58;
                              msg_49.m_end = pvVar58;
                              msg_49.m_begin = pvVar55;
                              boost::unit_test::unit_test_log_t::set_checkpoint
                                        (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                         file_49,(size_t)&local_f68,msg_49);
                              __l_54._M_len = 1;
                              __l_54._M_array = (iterator)&local_408;
                              local_408 = _Var41;
                              std::
                              set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                              ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                     *)&tx1_1,__l_54,(CompareIteratorByHash *)&local_428._M_value,
                                    (allocator_type *)&local_448._M_value);
                              _cVar68 = 0x5372db;
                              CTxMemPool::CheckConflictTopology_abi_cxx11_
                                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&entry_1,this_02,(setEntries *)&tx1_1);
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start =
                                   (pointer)(CONCAT71(witness.stack.
                                                                                                            
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  entry_1.spendsCoinbase) ^ 1);
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                              local_3e8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                           )0xec3d56;
                              _Stack_3e0 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                            )0xec3d94;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_finish =
                                   (pointer)((ulong)tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                            0xffffffffffffff00);
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start =
                                   (pointer)&PTR__lazy_ostream_013ae1c8;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage =
                                   (pointer)boost::unit_test::lazy_ostream::inst;
                              local_f78 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_f70 = "";
                              pvVar55 = (iterator)0x0;
                              tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_start = (pointer)&local_3e8;
                              boost::test_tools::tt_detail::report_assertion
                                        ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,0,
                                         WARN,_cVar68,(size_t)&local_f78,0x13d);
                              boost::detail::shared_count::~shared_count
                                        ((shared_count *)
                                         &witness.stack.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              if (entry_1.spendsCoinbase == true) {
                                entry_1.spendsCoinbase = false;
                                if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                  operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                                }
                              }
                              std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                              pCVar57 = this_02;
                              add_descendants(&local_f88,
                                              (int32_t)tx9.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,
                                              (CTxMemPool *)
                                              tx9.
                                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi);
                              if (local_f88.
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_f88.
                                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                              local_f98 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_f90 = "";
                              local_fa8 = &boost::unit_test::basic_cstring<char_const>::null;
                              local_fa0 = &boost::unit_test::basic_cstring<char_const>::null;
                              file_50.m_end = (iterator)0x141;
                              file_50.m_begin = (iterator)&local_f98;
                              msg_50.m_end = pvVar55;
                              msg_50.m_begin = (iterator)pCVar57;
                              boost::unit_test::unit_test_log_t::set_checkpoint
                                        (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                         file_50,(size_t)&local_fa8,msg_50);
                              __l_55._M_len = 1;
                              __l_55._M_array = (iterator)&local_408;
                              local_408 = _Var41;
                              std::
                              set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                              ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                     *)&tx1_1,__l_55,(CompareIteratorByHash *)&local_428._M_value,
                                    (allocator_type *)&local_448._M_value);
                              _cVar68 = 0x537490;
                              CTxMemPool::CheckConflictTopology_abi_cxx11_
                                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&entry_1,this_02,(setEntries *)&tx1_1);
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start =
                                   (pointer)(CONCAT71(witness.stack.
                                                                                                            
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  entry_1.spendsCoinbase) ^ 1);
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                              local_3e8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                           )0xec3d56;
                              _Stack_3e0 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                            )0xec3d94;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_finish =
                                   (pointer)((ulong)tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                            0xffffffffffffff00);
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start =
                                   (pointer)&PTR__lazy_ostream_013ae1c8;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage =
                                   (pointer)boost::unit_test::lazy_ostream::inst;
                              local_fb8 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_fb0 = "";
                              pvVar55 = (iterator)0x1;
                              pvVar58 = (iterator)0x0;
                              tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_start = (pointer)&local_3e8;
                              boost::test_tools::tt_detail::report_assertion
                                        ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,0,
                                         WARN,_cVar68,(size_t)&local_fb8,0x141);
                              boost::detail::shared_count::~shared_count
                                        ((shared_count *)
                                         &witness.stack.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              if (entry_1.spendsCoinbase == true) {
                                entry_1.spendsCoinbase = false;
                                if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                  operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                                }
                              }
                              std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                              local_fc8 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_fc0 = "";
                              local_fd8 = &boost::unit_test::basic_cstring<char_const>::null;
                              local_fd0 = &boost::unit_test::basic_cstring<char_const>::null;
                              file_51.m_end = (iterator)0x144;
                              file_51.m_begin = (iterator)&local_fc8;
                              msg_51.m_end = pvVar58;
                              msg_51.m_begin = pvVar55;
                              boost::unit_test::unit_test_log_t::set_checkpoint
                                        (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                         file_51,(size_t)&local_fd8,msg_51);
                              __l_56._M_len = 3;
                              __l_56._M_array = (iterator)&local_3e8;
                              local_3e8 = _Var41;
                              _Stack_3e0 = _Var42;
                              apuStack_3d8[0] = (undefined1 *)_Var43;
                              std::
                              set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                              ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                     *)&tx1_1,__l_56,(CompareIteratorByHash *)&local_428._M_value,
                                    (allocator_type *)&local_448._M_value);
                              _cVar68 = 0x53760a;
                              CTxMemPool::CheckConflictTopology_abi_cxx11_
                                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&entry_1,this_02,(setEntries *)&tx1_1);
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start =
                                   (pointer)(CONCAT71(witness.stack.
                                                                                                            
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  entry_1.spendsCoinbase) ^ 1);
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                              witness.stack.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                              local_408 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                           )0xec3d95;
                              local_400.__r = 0xec3df9;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_finish =
                                   (pointer)((ulong)tx2_1.vin.
                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                            0xffffffffffffff00);
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start =
                                   (pointer)&PTR__lazy_ostream_013ae1c8;
                              tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage =
                                   (pointer)boost::unit_test::lazy_ostream::inst;
                              local_fe8 = 
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                              ;
                              local_fe0 = "";
                              pvVar55 = (iterator)0x0;
                              tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                              .super__Vector_impl_data._M_start = (pointer)&local_408;
                              boost::test_tools::tt_detail::report_assertion
                                        ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,0,
                                         WARN,_cVar68,(size_t)&local_fe8,0x144);
                              boost::detail::shared_count::~shared_count
                                        ((shared_count *)
                                         &witness.stack.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                              if (entry_1.spendsCoinbase == true) {
                                entry_1.spendsCoinbase = false;
                                if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                  operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                                }
                              }
                              std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1);
                              pCVar57 = this_02;
                              add_descendants(&child_tx,
                                              (int32_t)tx10.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,
                                              (CTxMemPool *)
                                              tx10.
                                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi);
                              oVar59 = CTxMemPool::GetIter(this_02,&((child_tx.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                              if (((undefined1  [16])
                                   oVar59.
                                   super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                  & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                  std::__throw_bad_optional_access();
                                }
                              }
                              else {
                                local_1008 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                ;
                                local_1000 = "";
                                local_1018 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_1010 = &boost::unit_test::basic_cstring<char_const>::null;
                                file_52.m_end = (iterator)0x149;
                                file_52.m_begin = (iterator)&local_1008;
                                msg_52.m_end = pvVar55;
                                msg_52.m_begin = (iterator)pCVar57;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           file_52,(size_t)&local_1018,msg_52);
                                __l_57._M_len = 3;
                                __l_57._M_array = (iterator)&local_3e8;
                                local_3e8 = _Var41;
                                _Stack_3e0 = _Var42;
                                apuStack_3d8[0] = (undefined1 *)_Var43;
                                std::
                                set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                       *)&tx1_1,__l_57,(CompareIteratorByHash *)&local_428._M_value,
                                      (allocator_type *)&local_448._M_value);
                                _cVar68 = 0x5377d2;
                                CTxMemPool::CheckConflictTopology_abi_cxx11_
                                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&entry_1,this_02,(setEntries *)&tx1_1);
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start =
                                     (pointer)(CONCAT71(witness.stack.
                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  entry_1.spendsCoinbase) ^ 1);
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                local_408 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                             )0xec3d95;
                                local_400.__r = 0xec3df9;
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_finish =
                                     (pointer)((ulong)tx2_1.vin.
                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                              0xffffffffffffff00);
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start =
                                     (pointer)&PTR__lazy_ostream_013ae1c8;
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage =
                                     (pointer)boost::unit_test::lazy_ostream::inst;
                                local_1028 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                ;
                                local_1020 = "";
                                pvVar55 = (iterator)0x1;
                                pvVar58 = (iterator)0x0;
                                tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)&local_408;
                                boost::test_tools::tt_detail::report_assertion
                                          ((assertion_result *)&witness,(lazy_ostream *)&tx2_1,1,0,
                                           WARN,_cVar68,(size_t)&local_1028,0x149);
                                boost::detail::shared_count::~shared_count
                                          ((shared_count *)
                                           &witness.stack.
                                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                                if (entry_1.spendsCoinbase == true) {
                                  entry_1.spendsCoinbase = false;
                                  if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                    operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                                  }
                                }
                                std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1)
                                ;
                                local_1038 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                ;
                                local_1030 = "";
                                local_1048 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_1040 = &boost::unit_test::basic_cstring<char_const>::null;
                                file_53.m_end = (iterator)0x14a;
                                file_53.m_begin = (iterator)&local_1038;
                                msg_53.m_end = pvVar58;
                                msg_53.m_begin = pvVar55;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           file_53,(size_t)&local_1048,msg_53);
                                __l_58._M_len = 4;
                                __l_58._M_array = (iterator)&tx2_1;
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_start = (pointer)_Var41;
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_finish = (pointer)_Var42;
                                tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage = (pointer)_Var43;
                                tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     (pointer)oVar59.
                                              super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                              ._M_payload.
                                              super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                              ._M_payload;
                                std::
                                set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                       *)&tx1_1,__l_58,(CompareIteratorByHash *)&local_428._M_value,
                                      (allocator_type *)&local_448._M_value);
                                _cVar68 = 0x537944;
                                CTxMemPool::CheckConflictTopology_abi_cxx11_
                                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&entry_1,this_02,(setEntries *)&tx1_1);
                                local_3e8.field2 =
                                     CONCAT71(local_3e8._1_7_,entry_1.spendsCoinbase) ^ 1;
                                _Stack_3e0 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                              )0x0;
                                apuStack_3d8[0] = (undefined1 *)0x0;
                                local_408 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                             )0xec3dfa;
                                local_400.__r = 0xec3e6d;
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish =
                                     (pointer)((ulong)witness.stack.
                                                                                                            
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish &
                                              0xffffffffffffff00);
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start =
                                     (pointer)&PTR__lazy_ostream_013ae1c8;
                                witness.stack.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                     (pointer)boost::unit_test::lazy_ostream::inst;
                                local_1058 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                ;
                                local_1050 = "";
                                pvVar55 = (iterator)0x0;
                                boost::test_tools::tt_detail::report_assertion
                                          ((assertion_result *)&local_3e8._M_value,
                                           (lazy_ostream *)&witness,1,0,WARN,_cVar68,
                                           (size_t)&local_1058,0x14a);
                                boost::detail::shared_count::~shared_count
                                          ((shared_count *)
                                           &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)apuStack_3d8)->_M_allocated_capacity);
                                if (entry_1.spendsCoinbase == true) {
                                  entry_1.spendsCoinbase = false;
                                  if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                    operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                                  }
                                }
                                std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&tx1_1)
                                ;
                                pCVar57 = this_02;
                                add_descendants(&grand_child_tx,
                                                (int32_t)child_tx.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,
                                                (CTxMemPool *)
                                                child_tx.
                                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi);
                                oVar59 = CTxMemPool::GetIter(this_02,&((grand_child_tx.
                                                                                                                                                
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                                _Var34 = oVar59.
                                         super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                         ._M_payload.
                                         super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                         ._M_payload;
                                if (((undefined1  [16])
                                     oVar59.
                                     super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                     ._M_payload.
                                     super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                    & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                    std::__throw_bad_optional_access();
                                  }
                                }
                                else {
                                  local_1078 = 
                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                  ;
                                  local_1070 = "";
                                  local_1088 = &boost::unit_test::basic_cstring<char_const>::null;
                                  local_1080 = &boost::unit_test::basic_cstring<char_const>::null;
                                  file_54.m_end = (iterator)0x14f;
                                  file_54.m_begin = (iterator)&local_1078;
                                  msg_54.m_end = pvVar55;
                                  msg_54.m_begin = (iterator)pCVar57;
                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                            (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                             file_54,(size_t)&local_1088,msg_54);
                                  _Stack_3e0.field2 = _Stack_3e0.field2 & 0xffffffffffffff00;
                                  local_3e8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                               )&PTR__lazy_ostream_013ae088;
                                  apuStack_3d8[0] = boost::unit_test::lazy_ostream::inst;
                                  apuStack_3d8[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5)
                                  ;
                                  p_Var50 = &local_40;
                                  __l_59._M_len = 3;
                                  __l_59._M_array = (iterator)&local_470;
                                  local_470 = _Var41;
                                  local_468 = _Var42;
                                  aStack_460._M_allocated_capacity = (size_type)_Var43;
                                  std::
                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                  ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                         *)&tx1_1,__l_59,(CompareIteratorByHash *)&p_Var50->_M_value
                                        ,(allocator_type *)local_70);
                                  CTxMemPool::CheckConflictTopology_abi_cxx11_
                                            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&((
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  *)&entry_1)->_M_value,this_02,(setEntries *)&tx1_1
                                            );
                                  if (entry_1.spendsCoinbase == false) {
                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                      std::__throw_bad_optional_access();
                                    }
                                  }
                                  else {
                                    lVar51 = *(long *)_Var42;
                                    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                              (_Var42.field2 + 8);
                                    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                      if (__libc_single_threaded == '\0') {
                                        LOCK();
                                        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                        UNLOCK();
                                      }
                                      else {
                                        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                      }
                                    }
                                    base_blob<256u>::ToString_abi_cxx11_
                                              ((string *)&local_428._M_value,(void *)(lVar51 + 0x39)
                                              );
                                    tinyformat::format<std::__cxx11::string>
                                              ((string *)&local_408._M_value,
                                               (tinyformat *)"%s has 2 descendants, max 1 allowed",
                                               (char *)&local_428,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&p_Var50->_M_value);
                                    if (entry_1.time.__d.__r == (duration)local_400.__r) {
                                      if (entry_1.time.__d.__r == 0) {
                                        bVar31 = true;
                                      }
                                      else {
                                        iVar32 = bcmp((void *)entry_1.nFee,(void *)local_408,
                                                      (size_t)entry_1.time.__d.__r);
                                        bVar31 = iVar32 == 0;
                                      }
                                    }
                                    else {
                                      bVar31 = false;
                                    }
                                    local_448._0_1_ = bVar31;
                                    _Stack_440._M_pi =
                                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                    aStack_438._M_allocated_capacity = 0;
                                    local_4a8._0_8_ =
                                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                    ;
                                    local_4a8._8_8_ = "";
                                    tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                    _M_impl.super__Vector_impl_data._M_start = (pointer)local_4b8;
                                    tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_finish =
                                         (pointer)((ulong)tx2_1.vin.
                                                                                                                    
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                    tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_start =
                                         (pointer)&PTR__lazy_ostream_013ae148;
                                    tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                                         (pointer)boost::unit_test::lazy_ostream::inst;
                                    witness.stack.
                                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish =
                                         (pointer)((ulong)witness.stack.
                                                                                                                    
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                    witness.stack.
                                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start =
                                         (pointer)&PTR__lazy_ostream_013ae148;
                                    witness.stack.
                                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                         (pointer)boost::unit_test::lazy_ostream::inst;
                                    pvVar55 = (iterator)0x1;
                                    pvVar58 = (iterator)0x2;
                                    two_parent_child_tx.
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (element_type *)&local_408;
                                    local_4b8._0_8_ =
                                         (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                          *)&entry_1;
                                    boost::test_tools::tt_detail::report_assertion
                                              ((assertion_result *)&local_448._M_value,
                                               (lazy_ostream *)&local_3e8._M_value,1,2,REQUIRE,
                                               0xec3e6e,(size_t)local_4a8,0x14f,&tx2_1,
                                               "tfm::format(\"%s has 2 descendants, max 1 allowed\", entry10_unchained->GetSharedTx()->GetHash().ToString())"
                                               ,(lazy_ostream *)&witness);
                                    boost::detail::shared_count::~shared_count
                                              ((shared_count *)&aStack_438._M_allocated_capacity);
                                    if ((undefined1 **)local_408.field2 != &local_3f8) {
                                      operator_delete((void *)local_408,(ulong)(local_3f8 + 1));
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_428.field2 != &aStack_418) {
                                      operator_delete((void *)local_428,
                                                      aStack_418._M_allocated_capacity + 1);
                                    }
                                    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                                (p_Var2);
                                    }
                                    if (entry_1.spendsCoinbase == true) {
                                      entry_1.spendsCoinbase = false;
                                      if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                        operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                                      }
                                    }
                                    std::_Rb_tree<$270907ca$>::~_Rb_tree
                                              ((_Rb_tree<_270907ca_> *)&tx1_1);
                                    local_1098 = 
                                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                    ;
                                    local_1090 = "";
                                    local_10a8 = &boost::unit_test::basic_cstring<char_const>::null;
                                    local_10a0 = &boost::unit_test::basic_cstring<char_const>::null;
                                    file_55.m_end = (iterator)0x151;
                                    file_55.m_begin = (iterator)&local_1098;
                                    msg_55.m_end = pvVar58;
                                    msg_55.m_begin = pvVar55;
                                    boost::unit_test::unit_test_log_t::set_checkpoint
                                              (boost::unit_test::(anonymous_namespace)::
                                               unit_test_log,file_55,(size_t)&local_10a8,msg_55);
                                    _Stack_3e0.field2 = _Stack_3e0.field2 & 0xffffffffffffff00;
                                    local_3e8 = (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                 )&PTR__lazy_ostream_013ae088;
                                    apuStack_3d8[0] = boost::unit_test::lazy_ostream::inst;
                                    apuStack_3d8[1] =
                                         (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
                                    p_Var50 = &local_40;
                                    __l_60._M_len = 3;
                                    __l_60._M_array = (iterator)&local_470;
                                    local_470 = _Var41;
                                    local_468 = _Var34;
                                    aStack_460._M_allocated_capacity = (size_type)_Var43;
                                    std::
                                    set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                    ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                           *)&tx1_1,__l_60,
                                          (CompareIteratorByHash *)&p_Var50->_M_value,
                                          (allocator_type *)local_70);
                                    CTxMemPool::CheckConflictTopology_abi_cxx11_
                                              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&((
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  *)&entry_1)->_M_value,this_02,(setEntries *)&tx1_1
                                              );
                                    if (entry_1.spendsCoinbase == false) {
                                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                        std::__throw_bad_optional_access();
                                      }
                                    }
                                    else {
                                      lVar51 = *(long *)_Var34;
                                      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                                (_Var34.field2 + 8);
                                      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                    0x0) {
                                        if (__libc_single_threaded == '\0') {
                                          LOCK();
                                          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                          UNLOCK();
                                        }
                                        else {
                                          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                        }
                                      }
                                      base_blob<256u>::ToString_abi_cxx11_
                                                ((string *)&local_428._M_value,
                                                 (void *)(lVar51 + 0x39));
                                      tinyformat::format<std::__cxx11::string>
                                                ((string *)&local_408._M_value,
                                                 (tinyformat *)"%s has 2 ancestors, max 1 allowed",
                                                 (char *)&local_428,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&p_Var50->_M_value);
                                      if (entry_1.time.__d.__r == (duration)local_400.__r) {
                                        if (entry_1.time.__d.__r == 0) {
                                          bVar31 = true;
                                        }
                                        else {
                                          iVar32 = bcmp((void *)entry_1.nFee,(void *)local_408,
                                                        (size_t)entry_1.time.__d.__r);
                                          bVar31 = iVar32 == 0;
                                        }
                                      }
                                      else {
                                        bVar31 = false;
                                      }
                                      local_448._0_1_ = bVar31;
                                      _Stack_440._M_pi =
                                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                      aStack_438._M_allocated_capacity = 0;
                                      local_4a8._0_8_ =
                                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                      ;
                                      local_4a8._8_8_ = "";
                                      tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                      _M_impl.super__Vector_impl_data._M_finish =
                                           (pointer)((ulong)tx2_1.vin.
                                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                      tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                      _M_impl.super__Vector_impl_data._M_start =
                                           (pointer)&PTR__lazy_ostream_013ae148;
                                      tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)boost::unit_test::lazy_ostream::inst;
                                      tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4b8
                                      ;
                                      witness.stack.
                                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish =
                                           (pointer)((ulong)witness.stack.
                                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                      witness.stack.
                                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           (pointer)&PTR__lazy_ostream_013ae148;
                                      witness.stack.
                                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)boost::unit_test::lazy_ostream::inst;
                                      pvVar55 = (iterator)0x1;
                                      pvVar58 = (iterator)0x2;
                                      two_parent_child_tx.
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr = (element_type *)&local_408;
                                      local_4b8._0_8_ =
                                           (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                            *)&entry_1;
                                      boost::test_tools::tt_detail::report_assertion
                                                ((assertion_result *)&local_448._M_value,
                                                 (lazy_ostream *)&local_3e8._M_value,1,2,REQUIRE,
                                                 0xec3f5a,(size_t)local_4a8,0x151,&tx2_1,
                                                 "tfm::format(\"%s has 2 ancestors, max 1 allowed\", entry10_grand_child->GetSharedTx()->GetHash().ToString())"
                                                 ,(lazy_ostream *)&witness);
                                      boost::detail::shared_count::~shared_count
                                                ((shared_count *)&aStack_438._M_allocated_capacity);
                                      if ((undefined1 **)local_408.field2 != &local_3f8) {
                                        operator_delete((void *)local_408,(ulong)(local_3f8 + 1));
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_428.field2 != &aStack_418) {
                                        operator_delete((void *)local_428,
                                                        aStack_418._M_allocated_capacity + 1);
                                      }
                                      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                    0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release(p_Var2);
                                      }
                                      if (entry_1.spendsCoinbase == true) {
                                        entry_1.spendsCoinbase = false;
                                        if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                          operator_delete((void *)entry_1.nFee,entry_1._16_8_ + 1);
                                        }
                                      }
                                      std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                ((_Rb_tree<_270907ca_> *)&tx1_1);
                                      tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                      _M_impl.super__Vector_impl_data._M_start =
                                           (pointer)tx11.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                      tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                      _M_impl.super__Vector_impl_data._M_finish =
                                           (pointer)tx11.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi;
                                      if (tx11.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        if (__libc_single_threaded == '\0') {
                                          LOCK();
                                          (tx11.
                                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (tx11.
                                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                          UNLOCK();
                                        }
                                        else {
                                          (tx11.
                                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (tx11.
                                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                        }
                                      }
                                      tx2_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)tx12.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr;
                                      tx2_1.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           (pointer)tx12.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi;
                                      if (tx12.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        if (__libc_single_threaded == '\0') {
                                          LOCK();
                                          (tx12.
                                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (tx12.
                                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                          UNLOCK();
                                        }
                                        else {
                                          (tx12.
                                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (tx12.
                                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                        }
                                      }
                                      __l_61._M_len = 2;
                                      __l_61._M_array = (iterator)&tx2_1;
                                      std::
                                      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                                *)&witness,__l_61,
                                               (allocator_type *)&local_428._M_value);
                                      entry_1.nFee = 0;
                                      entry_1.time.__d.__r = (duration)0;
                                      entry_1.nHeight = 1;
                                      entry_1.m_sequence = 0;
                                      entry_1.spendsCoinbase = false;
                                      entry_1.sigOpCost = 4;
                                      entry_1.lp.height = 0;
                                      entry_1.lp.time = 0;
                                      entry_1.lp.maxInputBlock = (CBlockIndex *)0x0;
                                      local_3e8 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )0x2faf080;
                                      __l_62._M_len = 1;
                                      __l_62._M_array = (iterator)&local_3e8;
                                      std::vector<long,_std::allocator<long>_>::vector
                                                ((vector<long,_std::allocator<long>_> *)&tx1_1,
                                                 __l_62,(allocator_type *)&local_408._M_value);
                                      make_tx((rbf_tests *)&two_parent_child_tx,
                                              (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                               *)&witness,
                                              (vector<long,_std::allocator<long>_> *)&tx1_1);
                                      pvVar11 = (void *)CONCAT71(tx1_1.vin.
                                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                                      if (pvVar11 != (void *)0x0) {
                                        operator_delete(pvVar11,CONCAT71(tx1_1.vin.
                                                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _1_7_,(char)tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  - (long)pvVar11);
                                      }
                                      TestMemPoolEntryHelper::FromTx
                                                ((CTxMemPoolEntry *)&tx1_1,&entry_1,
                                                 &two_parent_child_tx);
                                      CTxMemPool::addUnchecked(this_02,(CTxMemPoolEntry *)&tx1_1);
                                      std::
                                      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                      ::~_Rb_tree((
                                                  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                                  *)&local_1b8);
                                      std::
                                      _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                      ::~_Rb_tree((
                                                  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                                  *)&tx1_1.vin.
                                                                                                          
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                      ;
                                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          CONCAT71(tx1_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                                   tx1_1.vin.
                                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>
                                                   ._M_impl.super__Vector_impl_data._M_finish._0_1_)
                                          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   CONCAT71(tx1_1.vin.
                                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                                  tx1_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._0_1_));
                                      }
                                      std::
                                      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                                 *)&witness);
                                      lVar51 = 0x20;
                                      do {
                                        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                                  ((long)&entry_1.lp.maxInputBlock + lVar51);
                                        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                          _M_release(p_Var2);
                                        }
                                        lVar51 = lVar51 + -0x10;
                                      } while (lVar51 != 0);
                                      oVar59 = CTxMemPool::GetIter(this_02,&((two_parent_child_tx.
                                                                                                                                                            
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped);
                                      _Var34 = oVar59.
                                               super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                               ._M_payload.
                                               super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                               ._M_payload;
                                      if (((undefined1  [16])
                                           oVar59.
                                           super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                           ._M_payload.
                                           super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                          & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                                        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                          std::__throw_bad_optional_access();
                                        }
                                      }
                                      else {
                                        local_10d9._17_8_ =
                                             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                        ;
                                        local_10c0 = "";
                                        local_10d9._1_8_ =
                                             &boost::unit_test::basic_cstring<char_const>::null;
                                        local_10d9._9_8_ =
                                             &boost::unit_test::basic_cstring<char_const>::null;
                                        file_56.m_end = (iterator)0x156;
                                        file_56.m_begin = local_10d9 + 0x11;
                                        msg_56.m_end = pvVar58;
                                        msg_56.m_begin = pvVar55;
                                        boost::unit_test::unit_test_log_t::set_checkpoint
                                                  (boost::unit_test::(anonymous_namespace)::
                                                   unit_test_log,file_56,(size_t)(local_10d9 + 1),
                                                   msg_56);
                                        _Stack_3e0.field2 = _Stack_3e0.field2 & 0xffffffffffffff00;
                                        local_3e8 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )&PTR__lazy_ostream_013ae088;
                                        apuStack_3d8[0] = boost::unit_test::lazy_ostream::inst;
                                        apuStack_3d8[1] =
                                             (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
                                        pbVar49 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_10d9;
                                        __l_63._M_len = 1;
                                        __l_63._M_array = (iterator)local_70;
                                        local_70 = (undefined1  [8])_Var43;
                                        std::
                                        set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                        ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                               *)&tx1_1,__l_63,
                                              (CompareIteratorByHash *)&local_450._M_value,
                                              (allocator_type *)pbVar49);
                                        CTxMemPool::CheckConflictTopology_abi_cxx11_
                                                  ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&((
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  *)&entry_1)->_M_value,this_02,(setEntries *)&tx1_1
                                                  );
                                        if (entry_1.spendsCoinbase == false) {
                                          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                            std::__throw_bad_optional_access();
                                          }
                                        }
                                        else {
                                          sVar4 = *(size_type *)_Var43;
                                          p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **
                                                    )(_Var43.field2 + 8);
                                          if (p_Var2 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                             ) {
                                            if (__libc_single_threaded == '\0') {
                                              LOCK();
                                              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                              UNLOCK();
                                            }
                                            else {
                                              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                            }
                                          }
                                          base_blob<256u>::ToString_abi_cxx11_
                                                    ((string *)&local_428._M_value,
                                                     (void *)(sVar4 + 0x39));
                                          lVar51 = *(long *)_Var34;
                                          phVar5 = (((
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  *)(_Var34.field2 + 8))->_M_value).node;
                                          if (phVar5 != (
                                                  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                                                  *)0x0) {
                                            if (__libc_single_threaded == '\0') {
                                              LOCK();
                                              p_Var13 = (_Atomic_word *)
                                                        ((long)&(phVar5->
                                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                                  ).
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                                  .
                                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                                  .super_pod_value_holder<CTxMemPoolEntry> + 8);
                                              *p_Var13 = *p_Var13 + 1;
                                              UNLOCK();
                                            }
                                            else {
                                              p_Var13 = (_Atomic_word *)
                                                        ((long)&(phVar5->
                                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                                  ).
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                                  .
                                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                                  .super_pod_value_holder<CTxMemPoolEntry> + 8);
                                              *p_Var13 = *p_Var13 + 1;
                                            }
                                          }
                                          base_blob<256u>::ToString_abi_cxx11_
                                                    ((string *)&local_448._M_value,
                                                     (void *)(lVar51 + 0x39));
                                          tinyformat::
                                          format<std::__cxx11::string,std::__cxx11::string>
                                                    ((string *)&local_408._M_value,
                                                     (tinyformat *)
                                                     "%s is not the only parent of child %s",
                                                     (char *)&local_428,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_448._M_value,pbVar49);
                                          if (entry_1.time.__d.__r == (duration)local_400.__r) {
                                            if (entry_1.time.__d.__r == 0) {
                                              bVar31 = true;
                                            }
                                            else {
                                              iVar32 = bcmp((void *)entry_1.nFee,(void *)local_408,
                                                            (size_t)entry_1.time.__d.__r);
                                              bVar31 = iVar32 == 0;
                                            }
                                          }
                                          else {
                                            bVar31 = false;
                                          }
                                          local_470._0_1_ = bVar31;
                                          local_468 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )0x0;
                                          aStack_460._M_allocated_capacity = 0;
                                          local_4a8._0_8_ =
                                               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                          ;
                                          local_4a8._8_8_ = "";
                                          tx2_1.vin.
                                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                          super__Vector_impl_data._M_finish =
                                               (pointer)((ulong)tx2_1.vin.
                                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                          tx2_1.vin.
                                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                          super__Vector_impl_data._M_start =
                                               (pointer)&PTR__lazy_ostream_013ae148;
                                          tx2_1.vin.
                                          super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage =
                                               (pointer)boost::unit_test::lazy_ostream::inst;
                                          tx2_1.vout.
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_start =
                                               (pointer)local_4b8;
                                          witness.stack.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish =
                                               (pointer)((ulong)witness.stack.
                                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                          witness.stack.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start =
                                               (pointer)&PTR__lazy_ostream_013ae148;
                                          witness.stack.
                                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                               (pointer)boost::unit_test::lazy_ostream::inst;
                                          pvVar55 = (iterator)0x1;
                                          pvVar58 = (iterator)0x2;
                                          local_4b8._0_8_ =
                                               (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                *)&entry_1;
                                          local_40.field2 = &local_408;
                                          boost::test_tools::tt_detail::report_assertion
                                                    ((assertion_result *)&local_470._M_value,
                                                     (lazy_ostream *)&local_3e8._M_value,1,2,REQUIRE
                                                     ,0xec4046,(size_t)local_4a8,0x156,&tx2_1,
                                                                                                          
                                                  "tfm::format(\"%s is not the only parent of child %s\", entry11_unchained->GetSharedTx()->GetHash().ToString(), entry_two_parent_child->GetSharedTx()->GetHash().ToString())"
                                                  ,&witness);
                                          boost::detail::shared_count::~shared_count
                                                    ((shared_count *)
                                                     &aStack_460._M_allocated_capacity);
                                          if ((undefined1 **)local_408.field2 != &local_3f8) {
                                            operator_delete((void *)local_408,(ulong)(local_3f8 + 1)
                                                           );
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_448.field2 != &aStack_438) {
                                            operator_delete((void *)local_448,
                                                            aStack_438._M_allocated_capacity + 1);
                                          }
                                          if (phVar5 != (
                                                  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                                                  *)0x0) {
                                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                            _M_release((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                        *)phVar5);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_428.field2 != &aStack_418) {
                                            operator_delete((void *)local_428,
                                                            aStack_418._M_allocated_capacity + 1);
                                          }
                                          if (p_Var2 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                             ) {
                                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                            _M_release(p_Var2);
                                          }
                                          if (entry_1.spendsCoinbase == true) {
                                            entry_1.spendsCoinbase = false;
                                            if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                              operator_delete((void *)entry_1.nFee,
                                                              entry_1._16_8_ + 1);
                                            }
                                          }
                                          std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                    ((_Rb_tree<_270907ca_> *)&tx1_1);
                                          local_10f0 = 
                                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                          ;
                                          local_10e8 = "";
                                          local_1100 = &boost::unit_test::basic_cstring<char_const>
                                                        ::null;
                                          local_10f8 = &boost::unit_test::basic_cstring<char_const>
                                                        ::null;
                                          file_57.m_end = (iterator)0x157;
                                          file_57.m_begin = (iterator)&local_10f0;
                                          msg_57.m_end = pvVar58;
                                          msg_57.m_begin = pvVar55;
                                          boost::unit_test::unit_test_log_t::set_checkpoint
                                                    (boost::unit_test::(anonymous_namespace)::
                                                     unit_test_log,file_57,(size_t)&local_1100,
                                                     msg_57);
                                          _Stack_3e0.field2 = _Stack_3e0.field2 & 0xffffffffffffff00
                                          ;
                                          local_3e8 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )&PTR__lazy_ostream_013ae088;
                                          apuStack_3d8[0] = boost::unit_test::lazy_ostream::inst;
                                          apuStack_3d8[1] =
                                               (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
                                          pbVar49 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_10d9;
                                          __l_64._M_len = 1;
                                          __l_64._M_array = (iterator)local_70;
                                          local_70 = (undefined1  [8])_Var44;
                                          std::
                                          set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                          ::set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                 *)&tx1_1,__l_64,
                                                (CompareIteratorByHash *)&local_450._M_value,
                                                (allocator_type *)pbVar49);
                                          CTxMemPool::CheckConflictTopology_abi_cxx11_
                                                    ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&((
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  *)&entry_1)->_M_value,this_02,(setEntries *)&tx1_1
                                                  );
                                          if (entry_1.spendsCoinbase == false) {
                                            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                              std::__throw_bad_optional_access();
                                            }
                                          }
                                          else {
                                            sVar4 = *(size_type *)_Var44;
                                            p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       **)(_Var44.field2 + 8);
                                            if (p_Var2 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                               ) {
                                              if (__libc_single_threaded == '\0') {
                                                LOCK();
                                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                                UNLOCK();
                                              }
                                              else {
                                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                              }
                                            }
                                            base_blob<256u>::ToString_abi_cxx11_
                                                      ((string *)&local_428._M_value,
                                                       (void *)(sVar4 + 0x39));
                                            lVar51 = *(long *)_Var34;
                                            phVar5 = (((
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  *)(_Var34.field2 + 8))->_M_value).node;
                                            if (phVar5 != (
                                                  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                                                  *)0x0) {
                                              if (__libc_single_threaded == '\0') {
                                                LOCK();
                                                p_Var13 = (_Atomic_word *)
                                                          ((long)&(phVar5->
                                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                                  ).
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                                  .
                                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                                  .super_pod_value_holder<CTxMemPoolEntry> + 8);
                                                *p_Var13 = *p_Var13 + 1;
                                                UNLOCK();
                                              }
                                              else {
                                                p_Var13 = (_Atomic_word *)
                                                          ((long)&(phVar5->
                                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                                  ).
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                                  .
                                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                                  .super_pod_value_holder<CTxMemPoolEntry> + 8);
                                                *p_Var13 = *p_Var13 + 1;
                                              }
                                            }
                                            base_blob<256u>::ToString_abi_cxx11_
                                                      ((string *)&local_448._M_value,
                                                       (void *)(lVar51 + 0x39));
                                            tinyformat::
                                            format<std::__cxx11::string,std::__cxx11::string>
                                                      ((string *)&local_408._M_value,
                                                       (tinyformat *)
                                                       "%s is not the only parent of child %s",
                                                       (char *)&local_428,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_448._M_value,pbVar49);
                                            if (entry_1.time.__d.__r == (duration)local_400.__r) {
                                              if (entry_1.time.__d.__r == 0) {
                                                bVar31 = true;
                                              }
                                              else {
                                                iVar32 = bcmp((void *)entry_1.nFee,(void *)local_408
                                                              ,(size_t)entry_1.time.__d.__r);
                                                bVar31 = iVar32 == 0;
                                              }
                                            }
                                            else {
                                              bVar31 = false;
                                            }
                                            local_470._0_1_ = bVar31;
                                            local_468 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )0x0;
                                            aStack_460._M_allocated_capacity = 0;
                                            local_4a8._0_8_ =
                                                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                            ;
                                            local_4a8._8_8_ = "";
                                            tx2_1.vin.
                                            super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                            _M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)((ulong)tx2_1.vin.
                                                                                                                                    
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                            tx2_1.vin.
                                            super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                            _M_impl.super__Vector_impl_data._M_start =
                                                 (pointer)&PTR__lazy_ostream_013ae148;
                                            tx2_1.vin.
                                            super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)boost::unit_test::lazy_ostream::inst;
                                            tx2_1.vout.
                                            super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                            _M_impl.super__Vector_impl_data._M_start =
                                                 (pointer)local_4b8;
                                            witness.stack.
                                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)((ulong)witness.stack.
                                                                                                                                    
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                            witness.stack.
                                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start =
                                                 (pointer)&PTR__lazy_ostream_013ae148;
                                            witness.stack.
                                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)boost::unit_test::lazy_ostream::inst;
                                            pvVar55 = (iterator)0x1;
                                            pvVar58 = (iterator)0x2;
                                            local_4b8._0_8_ =
                                                 (_Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  *)&entry_1;
                                            local_40.field2 = &local_408;
                                            boost::test_tools::tt_detail::report_assertion
                                                      ((assertion_result *)&local_470._M_value,
                                                       (lazy_ostream *)&local_3e8._M_value,1,2,
                                                       REQUIRE,0xec414e,(size_t)local_4a8,0x157,
                                                       &tx2_1,
                                                  "tfm::format(\"%s is not the only parent of child %s\", entry12_unchained->GetSharedTx()->GetHash().ToString(), entry_two_parent_child->GetSharedTx()->GetHash().ToString())"
                                                  ,&witness);
                                            boost::detail::shared_count::~shared_count
                                                      ((shared_count *)
                                                       &aStack_460._M_allocated_capacity);
                                            if ((undefined1 **)local_408.field2 != &local_3f8) {
                                              operator_delete((void *)local_408,
                                                              (ulong)(local_3f8 + 1));
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_448.field2 != &aStack_438) {
                                              operator_delete((void *)local_448,
                                                              aStack_438._M_allocated_capacity + 1);
                                            }
                                            if (phVar5 != (
                                                  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                                                  *)0x0) {
                                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                              _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  phVar5);
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_428.field2 != &aStack_418) {
                                              operator_delete((void *)local_428,
                                                              aStack_418._M_allocated_capacity + 1);
                                            }
                                            if (p_Var2 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                               ) {
                                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                              _M_release(p_Var2);
                                            }
                                            if (entry_1.spendsCoinbase == true) {
                                              entry_1.spendsCoinbase = false;
                                              if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                                operator_delete((void *)entry_1.nFee,
                                                                entry_1._16_8_ + 1);
                                              }
                                            }
                                            std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                      ((_Rb_tree<_270907ca_> *)&tx1_1);
                                            local_1110 = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                            ;
                                            local_1108 = "";
                                            local_1120 = &boost::unit_test::
                                                          basic_cstring<char_const>::null;
                                            local_1118 = &boost::unit_test::
                                                          basic_cstring<char_const>::null;
                                            file_58.m_end = (iterator)0x158;
                                            file_58.m_begin = (iterator)&local_1110;
                                            msg_58.m_end = pvVar58;
                                            msg_58.m_begin = pvVar55;
                                            boost::unit_test::unit_test_log_t::set_checkpoint
                                                      (boost::unit_test::(anonymous_namespace)::
                                                       unit_test_log,file_58,(size_t)&local_1120,
                                                       msg_58);
                                            _Stack_3e0.field2 =
                                                 _Stack_3e0.field2 & 0xffffffffffffff00;
                                            local_3e8 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )&PTR__lazy_ostream_013ae088;
                                            apuStack_3d8[0] = boost::unit_test::lazy_ostream::inst;
                                            apuStack_3d8[1] =
                                                 (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
                                            pbVar49 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_70;
                                            __l_65._M_len = 1;
                                            __l_65._M_array = (iterator)&local_40;
                                            local_40 = _Var34;
                                            std::
                                            set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                            ::set((
                                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                  *)&tx1_1,__l_65,(CompareIteratorByHash *)pbVar49,
                                                  (allocator_type *)&local_450._M_value);
                                            CTxMemPool::CheckConflictTopology_abi_cxx11_
                                                      ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&((
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  *)&entry_1)->_M_value,this_02,(setEntries *)&tx1_1
                                                  );
                                            if (entry_1.spendsCoinbase == false) {
                                              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                std::__throw_bad_optional_access();
                                              }
                                            }
                                            else {
                                              lVar51 = *(long *)_Var34;
                                              phVar5 = (((
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  *)(_Var34.field2 + 8))->_M_value).node;
                                              if (phVar5 != (
                                                  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                                                  *)0x0) {
                                                if (__libc_single_threaded == '\0') {
                                                  LOCK();
                                                  p_Var13 = (_Atomic_word *)
                                                            ((long)&(phVar5->
                                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                                  ).
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                                  .
                                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                                  .super_pod_value_holder<CTxMemPoolEntry> + 8);
                                                  *p_Var13 = *p_Var13 + 1;
                                                  UNLOCK();
                                                }
                                                else {
                                                  p_Var13 = (_Atomic_word *)
                                                            ((long)&(phVar5->
                                                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                                  ).
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                                  .
                                                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                                  .
                                                  super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                                  .super_pod_value_holder<CTxMemPoolEntry> + 8);
                                                  *p_Var13 = *p_Var13 + 1;
                                                }
                                              }
                                              base_blob<256u>::ToString_abi_cxx11_
                                                        ((string *)&local_428._M_value,
                                                         (void *)(lVar51 + 0x39));
                                              tinyformat::format<std::__cxx11::string>
                                                        ((string *)&local_408._M_value,
                                                         (tinyformat *)
                                                         "%s has 2 ancestors, max 1 allowed",
                                                         (char *)&local_428,pbVar49);
                                              if (entry_1.time.__d.__r == (duration)local_400.__r) {
                                                if (entry_1.time.__d.__r == 0) {
                                                  bVar31 = true;
                                                }
                                                else {
                                                  iVar32 = bcmp((void *)entry_1.nFee,
                                                                (void *)local_408,
                                                                (size_t)entry_1.time.__d.__r);
                                                  bVar31 = iVar32 == 0;
                                                }
                                              }
                                              else {
                                                bVar31 = false;
                                              }
                                              local_448._0_1_ = bVar31;
                                              _Stack_440._M_pi =
                                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                   0x0;
                                              aStack_438._M_allocated_capacity = 0;
                                              local_470 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )0xec2eb4;
                                              local_468 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )((long)
                                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                                  + 0x5b);
                                              tx2_1.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_finish =
                                                   (pointer)((ulong)tx2_1.vin.
                                                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                              tx2_1.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_start =
                                                   (pointer)&PTR__lazy_ostream_013ae148;
                                              tx2_1.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage =
                                                   (pointer)boost::unit_test::lazy_ostream::inst;
                                              witness.stack.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish =
                                                   (pointer)((ulong)witness.stack.
                                                                                                                                        
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                              witness.stack.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start =
                                                   (pointer)&PTR__lazy_ostream_013ae148;
                                              witness.stack.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                   (pointer)boost::unit_test::lazy_ostream::inst;
                                              pvVar55 = (iterator)0x1;
                                              pvVar58 = (iterator)0x2;
                                              local_4b8._0_8_ = &local_408;
                                              local_4a8._0_8_ =
                                                   (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  *)&entry_1;
                                              tx2_1.vout.
                                              super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                              _M_impl.super__Vector_impl_data._M_start =
                                                   (pointer)local_4a8;
                                              boost::test_tools::tt_detail::report_assertion
                                                        ((assertion_result *)&local_448._M_value,
                                                         (lazy_ostream *)&local_3e8._M_value,1,2,
                                                         REQUIRE,0xec4230,(size_t)&local_470,0x158,
                                                         &tx2_1,
                                                  "tfm::format(\"%s has 2 ancestors, max 1 allowed\", entry_two_parent_child->GetSharedTx()->GetHash().ToString())"
                                                  ,&witness);
                                              boost::detail::shared_count::~shared_count
                                                        ((shared_count *)
                                                         &aStack_438._M_allocated_capacity);
                                              if ((undefined1 **)local_408.field2 != &local_3f8) {
                                                operator_delete((void *)local_408,
                                                                (ulong)(local_3f8 + 1));
                                              }
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_428.field2 != &aStack_418) {
                                                operator_delete((void *)local_428,
                                                                aStack_418._M_allocated_capacity + 1
                                                               );
                                              }
                                              if (phVar5 != (
                                                  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                                                  *)0x0) {
                                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  phVar5);
                                              }
                                              if (entry_1.spendsCoinbase == true) {
                                                entry_1.spendsCoinbase = false;
                                                if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                                  operator_delete((void *)entry_1.nFee,
                                                                  entry_1._16_8_ + 1);
                                                }
                                              }
                                              std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                        ((_Rb_tree<_270907ca_> *)&tx1_1);
                                              this_03 = tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount;
                                              if (tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                if (__libc_single_threaded == '\0') {
                                                  LOCK();
                                                  (tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count =
                                                       (tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count + 1;
                                                  UNLOCK();
                                                }
                                                else {
                                                  (tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count =
                                                       (tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count + 1;
                                                }
                                              }
                                              entry_1.nFee = 0;
                                              entry_1.time.__d.__r = (duration)0;
                                              entry_1.nHeight = 1;
                                              entry_1.m_sequence = 0;
                                              entry_1.spendsCoinbase = false;
                                              entry_1.sigOpCost = 4;
                                              entry_1.lp.height = 0;
                                              entry_1.lp.time = 0;
                                              entry_1.lp.maxInputBlock = (CBlockIndex *)0x0;
                                              if (tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                if (__libc_single_threaded == '\0') {
                                                  LOCK();
                                                  (tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count =
                                                       (tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count + 1;
                                                  UNLOCK();
                                                }
                                                else {
                                                  (tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count =
                                                       (tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count + 1;
                                                }
                                              }
                                              local_470 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )0x2faf080;
                                              __l_66._M_len = 1;
                                              __l_66._M_array = (iterator)&local_470;
                                              std::vector<long,_std::allocator<long>_>::vector
                                                        ((vector<long,_std::allocator<long>_> *)
                                                         &local_408._M_value,__l_66,
                                                         (allocator_type *)local_4b8);
                                              if ((ulong)(((long)((tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->vout).
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)((tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->vout).
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                                  -0x3333333333333333) < 2) {
                                                __assert_fail("parent->vout.size() >= 2",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                                  ,0x2d,
                                                  "std::pair<CTransactionRef, CTransactionRef> rbf_tests::make_two_siblings(const CTransactionRef, const std::vector<CAmount> &)"
                                                  );
                                              }
                                              CMutableTransaction::CMutableTransaction(&tx1_1);
                                              std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
                                                        (&tx1_1.vin,1);
                                              this_01 = &tx1_1.vout;
                                              std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
                                                        (this_01,local_400.__r - (long)local_408 >>
                                                                 3);
                                              puVar12 = (undefined8 *)
                                                        CONCAT71(tx1_1.vin.
                                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                                              uVar7 = *(undefined8 *)
                                                       ((tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems;
                                              uVar8 = *(undefined8 *)
                                                       (((tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 8);
                                              uVar9 = *(undefined8 *)
                                                       (((tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x18);
                                              puVar12[2] = *(undefined8 *)
                                                            (((tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.
                                                  m_data._M_elems + 0x10);
                                              puVar12[3] = uVar9;
                                              *puVar12 = uVar7;
                                              puVar12[1] = uVar8;
                                              *(undefined4 *)
                                               (CONCAT71(tx1_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) + 0x20)
                                                   = 0;
                                              witness.stack.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start =
                                                   (pointer)0x0;
                                              witness.stack.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish =
                                                   (pointer)0x0;
                                              witness.stack.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                   (pointer)0x0;
                                              tx2_1.vin.
                                              super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                              _M_impl.super__Vector_impl_data._M_start =
                                                   (pointer)CONCAT44(tx2_1.vin.
                                                                                                                                          
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,10)
                                              ;
                                              std::
                                              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ::emplace_back<int>(&witness.stack,(int *)&tx2_1);
                                              std::
                                              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ::operator=((
                                                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  *)(CONCAT71(tx1_1.vin.
                                                                                                                            
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)tx1_1.vin.
                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) + 0x50),
                                                  &witness.stack);
                                              if (local_400.__r != local_408.field2) {
                                                lVar51 = 8;
                                                uVar53 = 0;
                                                do {
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  tx2_1.vout.
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_428._0_1_ = 0x5b;
                                                  prevector<28U,_unsigned_char,_unsigned_int,_int>::
                                                  insert((
                                                  prevector<28U,_unsigned_char,_unsigned_int,_int> *
                                                  )&tx2_1,(iterator)&tx2_1,(uchar *)&local_428);
                                                  uVar48 = tx2_1.vout.
                                                                                                                      
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_ -
                                                  0x1d;
                                                  if (tx2_1.vout.
                                                                                                            
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_ <
                                                  0x1d) {
                                                    uVar48 = tx2_1.vout.
                                                                                                                          
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_;
                                                  }
                                                  pCVar52 = tx2_1.vin.
                                                                                                                        
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                                  if (tx2_1.vout.
                                                                                                            
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_ <
                                                  0x1d) {
                                                    pCVar52 = (pointer)&tx2_1;
                                                  }
                                                  local_428._0_1_ = 0x87;
                                                  prevector<28U,_unsigned_char,_unsigned_int,_int>::
                                                  insert((
                                                  prevector<28U,_unsigned_char,_unsigned_int,_int> *
                                                  )&tx2_1,(uchar *)((long)&pCVar52->prevout +
                                                                   (long)(int)uVar48),
                                                  (uchar *)&local_428);
                                                  prevector<28U,_unsigned_char,_unsigned_int,_int>::
                                                  operator=((
                                                  prevector<28U,_unsigned_char,_unsigned_int,_int> *
                                                  )(CONCAT71(tx1_1.vout.
                                                                                                                          
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  tx1_1.vout.
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                                  lVar51),(
                                                  prevector<28U,_unsigned_char,_unsigned_int,_int> *
                                                  )&tx2_1);
                                                  if (0x1c < tx2_1.vout.
                                                                                                                          
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_) {
                                                    free(tx2_1.vin.
                                                                                                                  
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  *(undefined1 **)
                                                   (CONCAT71(tx1_1.vout.
                                                                                                                          
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  tx1_1.vout.
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                                  -8 + lVar51) = *(undefined1 **)
                                                                  (local_408.field2 + uVar53 * 8);
                                                  uVar53 = uVar53 + 1;
                                                  lVar51 = lVar51 + 0x28;
                                                } while (uVar53 < (ulong)(local_400.__r -
                                                                          (long)local_408 >> 3));
                                              }
                                              std::vector<CTxIn,_std::allocator<CTxIn>_>::vector
                                                        (&tx2_1.vin,&tx1_1.vin);
                                              std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                                                        (&tx2_1.vout,this_01);
                                              tx2_1.version = tx1_1.version;
                                              tx2_1.nLockTime = tx1_1.nLockTime;
                                              ((tx2_1.vin.
                                                super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                _M_impl.super__Vector_impl_data._M_start)->prevout).
                                              n = 1;
                                              local_428 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )0x0;
                                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                              __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
                                                        ((__shared_count<(__gnu_cxx::_Lock_policy)2>
                                                          *)&_Stack_420._M_value,
                                                         (CTransaction **)&local_428,
                                                         (allocator<CTransaction> *)&local_448,
                                                         &tx1_1);
                                              local_448 = (
                                                  _Storage<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true>
                                                  )0x0;
                                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                              __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
                                                        (&_Stack_440,(CTransaction **)&local_448,
                                                         (allocator<CTransaction> *)local_4a8,&tx2_1
                                                        );
                                              local_3e8 = local_428;
                                              _Stack_3e0 = _Stack_420;
                                              apuStack_3d8[0] = (undefined1 *)local_448;
                                              apuStack_3d8[1] = (undefined1 *)_Stack_440._M_pi;
                                              std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                                                        (&tx2_1.vout);
                                              std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                                                        (&tx2_1.vin);
                                              std::
                                              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ::~vector(&witness.stack);
                                              std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                                                        (this_01);
                                              std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                                                        (&tx1_1.vin);
                                              if ((undefined1 **)local_408.field2 !=
                                                  (undefined1 **)0x0) {
                                                operator_delete((void *)local_408,
                                                                (long)local_3f8 - (long)local_408);
                                              }
                                              if (this_03._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                _M_release(this_03._M_pi);
                                              }
                                              TestMemPoolEntryHelper::FromTx
                                                        ((CTxMemPoolEntry *)&tx1_1,&entry_1,
                                                         (CTransactionRef *)&local_3e8._M_value);
                                              CTxMemPool::addUnchecked
                                                        (this_02,(CTxMemPoolEntry *)&tx1_1);
                                              std::
                                              _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                              ::~_Rb_tree((
                                                  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                                  *)&local_1b8);
                                              std::
                                              _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                              ::~_Rb_tree((
                                                  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                                  *)&tx1_1.vin.
                                                                                                          
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                              ;
                                              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  CONCAT71(tx1_1.vin.
                                                                                                                      
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                                  tx1_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._0_1_)
                                                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *
                                                     )0x0) {
                                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  CONCAT71(tx1_1.vin.
                                                                                                                      
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                                  tx1_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._0_1_));
                                              }
                                              TestMemPoolEntryHelper::FromTx
                                                        ((CTxMemPoolEntry *)&tx1_1,&entry_1,
                                                         (CTransactionRef *)apuStack_3d8);
                                              CTxMemPool::addUnchecked
                                                        (this_02,(CTxMemPoolEntry *)&tx1_1);
                                              std::
                                              _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                              ::~_Rb_tree((
                                                  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                                  *)&local_1b8);
                                              std::
                                              _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                              ::~_Rb_tree((
                                                  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                                                  *)&tx1_1.vin.
                                                                                                          
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                              ;
                                              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  CONCAT71(tx1_1.vin.
                                                                                                                      
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                                  tx1_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._0_1_)
                                                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *
                                                     )0x0) {
                                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  CONCAT71(tx1_1.vin.
                                                                                                                      
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                                  tx1_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._0_1_));
                                              }
                                              if (this_03._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                _M_release(this_03._M_pi);
                                              }
                                              oVar59 = CTxMemPool::GetIter(this_02,(uint256 *)
                                                                                   (local_3e8.field2
                                                                                   + 0x39));
                                              _Var34 = oVar59.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  ._M_payload;
                                              if (((undefined1  [16])
                                                   oVar59.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                              {
                                                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                  std::__throw_bad_optional_access();
                                                }
                                              }
                                              else {
                                                oVar59 = CTxMemPool::GetIter(this_02,(uint256 *)
                                                                                     ((long)
                                                  apuStack_3d8[0] + 0x39));
                                                _Var35 = oVar59.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  ._M_payload;
                                                if (((undefined1  [16])
                                                     oVar59.
                                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                                  & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                                {
                                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                    std::__throw_bad_optional_access();
                                                  }
                                                }
                                                else {
                                                  local_1141._17_8_ =
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                                  ;
                                                  local_1128 = "";
                                                  local_1141._1_8_ =
                                                       &boost::unit_test::basic_cstring<char_const>
                                                        ::null;
                                                  local_1141._9_8_ =
                                                       &boost::unit_test::basic_cstring<char_const>
                                                        ::null;
                                                  file_59.m_end = (iterator)0x15e;
                                                  file_59.m_begin = local_1141 + 0x11;
                                                  msg_59.m_end = pvVar58;
                                                  msg_59.m_begin = pvVar55;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_59,
                                                             (size_t)(local_1141 + 1),msg_59);
                                                  local_400.__r = local_400.__r & 0xffffffffffffff00
                                                  ;
                                                  local_408.field2 = &PTR__lazy_ostream_013ae088;
                                                  local_3f8 = boost::unit_test::lazy_ostream::inst;
                                                  local_3f0 = "";
                                                  pbVar49 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1141;
                                                  __l_67._M_len = 1;
                                                  __l_67._M_array = (iterator)&local_450;
                                                  local_450 = _Var34;
                                                  std::
                                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                  ::set((
                                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                  *)&tx1_1,__l_67,
                                                  (CompareIteratorByHash *)local_10d9,
                                                  (allocator_type *)pbVar49);
                                                  CTxMemPool::CheckConflictTopology_abi_cxx11_
                                                            ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1,this_02,(setEntries *)&tx1_1);
                                                  if (entry_1.spendsCoinbase == false) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    lVar51 = *(long *)_Var34;
                                                    p_Var2 = *(
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                                  (_Var34.field2 + 8);
                                                  if (p_Var2 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ) {
                                                    if (__libc_single_threaded == '\0') {
                                                      LOCK();
                                                      p_Var2->_M_use_count =
                                                           p_Var2->_M_use_count + 1;
                                                      UNLOCK();
                                                    }
                                                    else {
                                                      p_Var2->_M_use_count =
                                                           p_Var2->_M_use_count + 1;
                                                    }
                                                  }
                                                  base_blob<256u>::ToString_abi_cxx11_
                                                            ((string *)&local_448._M_value,
                                                             (void *)(lVar51 + 0x39));
                                                  lVar51 = *(long *)_Var45;
                                                  p_Var6 = *(
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                                  (_Var45.field2 + 8);
                                                  if (p_Var6 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ) {
                                                    if (__libc_single_threaded == '\0') {
                                                      LOCK();
                                                      p_Var6->_M_use_count =
                                                           p_Var6->_M_use_count + 1;
                                                      UNLOCK();
                                                    }
                                                    else {
                                                      p_Var6->_M_use_count =
                                                           p_Var6->_M_use_count + 1;
                                                    }
                                                  }
                                                  base_blob<256u>::ToString_abi_cxx11_
                                                            ((string *)&local_470._M_value,
                                                             (void *)(lVar51 + 0x39));
                                                  tinyformat::
                                                  format<std::__cxx11::string,std::__cxx11::string>
                                                            ((string *)&local_428,
                                                             (tinyformat *)
                                                             "%s is not the only child of parent %s"
                                                             ,(char *)&local_448,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_470._M_value,pbVar49);
                                                  if (entry_1.time.__d.__r ==
                                                      (duration)_Stack_420.field2) {
                                                    if (entry_1.time.__d.__r == 0) {
                                                      bVar31 = true;
                                                    }
                                                    else {
                                                      iVar32 = bcmp((void *)entry_1.nFee,
                                                                    (void *)local_428,
                                                                    (size_t)entry_1.time.__d.__r);
                                                      bVar31 = iVar32 == 0;
                                                    }
                                                  }
                                                  else {
                                                    bVar31 = false;
                                                  }
                                                  local_4a8[0] = bVar31;
                                                  local_4a8._8_8_ = (char *)0x0;
                                                  local_4a8._16_8_ = 0;
                                                  local_4b8._0_8_ =
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                                  ;
                                                  local_4b8._8_8_ = "";
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)((ulong)tx2_1.vin.
                                                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)&PTR__lazy_ostream_013ae148;
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)boost::unit_test::lazy_ostream::
                                                                  inst;
                                                  tx2_1.vout.
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)&local_40;
                                                  witness.stack.
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)((ulong)witness.stack.
                                                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                                  witness.stack.
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)&PTR__lazy_ostream_013ae148;
                                                  witness.stack.
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)boost::unit_test::lazy_ostream::
                                                                  inst;
                                                  pvVar55 = (iterator)0x1;
                                                  pvVar58 = (iterator)0x2;
                                                  local_70 = (undefined1  [8])&local_428;
                                                  local_40.field2 = &entry_1;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)local_4a8,
                                                             (lazy_ostream *)&local_408._M_value,1,2
                                                             ,REQUIRE,0xec42db,(size_t)local_4b8,
                                                             0x15e,&tx2_1,
                                                                                                                          
                                                  "tfm::format(\"%s is not the only child of parent %s\", entry_sibling_1->GetSharedTx()->GetHash().ToString(), entry13_unchained->GetSharedTx()->GetHash().ToString())"
                                                  ,&witness);
                                                  boost::detail::shared_count::~shared_count
                                                            ((shared_count *)(local_4a8 + 0x10));
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_428.field2 != &aStack_418) {
                                                    operator_delete((void *)local_428,
                                                                    aStack_418._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_470.field2 != &aStack_460) {
                                                    operator_delete((void *)local_470,
                                                                    (ulong)(aStack_460.
                                                                            _M_allocated_capacity +
                                                                           1));
                                                  }
                                                  if (p_Var6 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(p_Var6);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_448.field2 != &aStack_438) {
                                                    operator_delete((void *)local_448,
                                                                    aStack_438._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (p_Var2 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(p_Var2);
                                                  }
                                                  if (entry_1.spendsCoinbase == true) {
                                                    entry_1.spendsCoinbase = false;
                                                    if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                                      operator_delete((void *)entry_1.nFee,
                                                                      entry_1._16_8_ + 1);
                                                    }
                                                  }
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            ((_Rb_tree<_270907ca_> *)&tx1_1);
                                                  local_1158 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                                  ;
                                                  local_1150 = "";
                                                  local_1168 = &boost::unit_test::
                                                                basic_cstring<char_const>::null;
                                                  local_1160 = &boost::unit_test::
                                                                basic_cstring<char_const>::null;
                                                  file_60.m_end = (iterator)0x15f;
                                                  file_60.m_begin = (iterator)&local_1158;
                                                  msg_60.m_end = pvVar58;
                                                  msg_60.m_begin = pvVar55;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,file_60,
                                                             (size_t)&local_1168,msg_60);
                                                  local_400.__r = local_400.__r & 0xffffffffffffff00
                                                  ;
                                                  local_408.field2 = &PTR__lazy_ostream_013ae088;
                                                  local_3f8 = boost::unit_test::lazy_ostream::inst;
                                                  local_3f0 = "";
                                                  pbVar49 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1141;
                                                  __l_68._M_len = 1;
                                                  __l_68._M_array = (iterator)&local_450;
                                                  local_450 = _Var35;
                                                  std::
                                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                  ::set((
                                                  set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                                                  *)&tx1_1,__l_68,
                                                  (CompareIteratorByHash *)local_10d9,
                                                  (allocator_type *)pbVar49);
                                                  CTxMemPool::CheckConflictTopology_abi_cxx11_
                                                            ((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&entry_1,this_02,(setEntries *)&tx1_1);
                                                  if (entry_1.spendsCoinbase == false) {
                                                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38)
                                                    {
                                                      std::__throw_bad_optional_access();
                                                    }
                                                  }
                                                  else {
                                                    lVar51 = *(long *)_Var35;
                                                    p_Var2 = *(
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                                  (_Var35.field2 + 8);
                                                  if (p_Var2 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ) {
                                                    if (__libc_single_threaded == '\0') {
                                                      LOCK();
                                                      p_Var2->_M_use_count =
                                                           p_Var2->_M_use_count + 1;
                                                      UNLOCK();
                                                    }
                                                    else {
                                                      p_Var2->_M_use_count =
                                                           p_Var2->_M_use_count + 1;
                                                    }
                                                  }
                                                  base_blob<256u>::ToString_abi_cxx11_
                                                            ((string *)&local_448._M_value,
                                                             (void *)(lVar51 + 0x39));
                                                  lVar51 = *(long *)_Var45;
                                                  p_Var6 = *(
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                                  (_Var45.field2 + 8);
                                                  if (p_Var6 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ) {
                                                    if (__libc_single_threaded == '\0') {
                                                      LOCK();
                                                      p_Var6->_M_use_count =
                                                           p_Var6->_M_use_count + 1;
                                                      UNLOCK();
                                                    }
                                                    else {
                                                      p_Var6->_M_use_count =
                                                           p_Var6->_M_use_count + 1;
                                                    }
                                                  }
                                                  base_blob<256u>::ToString_abi_cxx11_
                                                            ((string *)&local_470._M_value,
                                                             (void *)(lVar51 + 0x39));
                                                  tinyformat::
                                                  format<std::__cxx11::string,std::__cxx11::string>
                                                            ((string *)&local_428,
                                                             (tinyformat *)
                                                             "%s is not the only child of parent %s"
                                                             ,(char *)&local_448,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_470._M_value,pbVar49);
                                                  if (entry_1.time.__d.__r ==
                                                      (duration)_Stack_420.field2) {
                                                    if (entry_1.time.__d.__r == 0) {
                                                      bVar31 = true;
                                                    }
                                                    else {
                                                      iVar32 = bcmp((void *)entry_1.nFee,
                                                                    (void *)local_428,
                                                                    (size_t)entry_1.time.__d.__r);
                                                      bVar31 = iVar32 == 0;
                                                    }
                                                  }
                                                  else {
                                                    bVar31 = false;
                                                  }
                                                  local_4a8[0] = bVar31;
                                                  local_4a8._8_8_ = (char *)0x0;
                                                  local_4a8._16_8_ = 0;
                                                  local_4b8._0_8_ =
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rbf_tests.cpp"
                                                  ;
                                                  local_4b8._8_8_ = "";
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)((ulong)tx2_1.vin.
                                                                                                                                                
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)&PTR__lazy_ostream_013ae148;
                                                  tx2_1.vin.
                                                  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)boost::unit_test::lazy_ostream::
                                                                  inst;
                                                  tx2_1.vout.
                                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)&local_40;
                                                  witness.stack.
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)((ulong)witness.stack.
                                                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish &
                                                  0xffffffffffffff00);
                                                  witness.stack.
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)&PTR__lazy_ostream_013ae148;
                                                  witness.stack.
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)boost::unit_test::lazy_ostream::
                                                                  inst;
                                                  local_70 = (undefined1  [8])&local_428;
                                                  local_40.field2 = &entry_1;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            ((assertion_result *)local_4a8,
                                                             (lazy_ostream *)&local_408._M_value,1,2
                                                             ,REQUIRE,0xec43da,(size_t)local_4b8,
                                                             0x15f,&tx2_1,
                                                                                                                          
                                                  "tfm::format(\"%s is not the only child of parent %s\", entry_sibling_2->GetSharedTx()->GetHash().ToString(), entry13_unchained->GetSharedTx()->GetHash().ToString())"
                                                  ,&witness);
                                                  boost::detail::shared_count::~shared_count
                                                            ((shared_count *)(local_4a8 + 0x10));
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_428.field2 != &aStack_418) {
                                                    operator_delete((void *)local_428,
                                                                    aStack_418._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_470.field2 != &aStack_460) {
                                                    operator_delete((void *)local_470,
                                                                    (ulong)(aStack_460.
                                                                            _M_allocated_capacity +
                                                                           1));
                                                  }
                                                  if (p_Var6 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(p_Var6);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_448.field2 != &aStack_438) {
                                                    operator_delete((void *)local_448,
                                                                    aStack_438._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (p_Var2 != (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(p_Var2);
                                                  }
                                                  if (entry_1.spendsCoinbase == true) {
                                                    entry_1.spendsCoinbase = false;
                                                    if ((uint *)entry_1.nFee != &entry_1.nHeight) {
                                                      operator_delete((void *)entry_1.nFee,
                                                                      entry_1._16_8_ + 1);
                                                    }
                                                  }
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            ((_Rb_tree<_270907ca_> *)&tx1_1);
                                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)apuStack_3d8[1] !=
                                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>
                                                       *)0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  apuStack_3d8[1]);
                                                  }
                                                  if (_Stack_3e0.field2 != 0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  _Stack_3e0);
                                                  }
                                                  if (two_parent_child_tx.
                                                                                                            
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(two_parent_child_tx.
                                                                                                                          
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (grand_child_tx.
                                                                                                            
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(grand_child_tx.
                                                                                                                          
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (child_tx.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(child_tx.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (spends_conflicting_confirmed.
                                                                                                            
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(spends_conflicting_confirmed.
                                                                                                                          
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (spends_new_unconfirmed.
                                                                                                            
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(spends_new_unconfirmed.
                                                                                                                          
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (spends_unconfirmed.
                                                                                                            
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(spends_unconfirmed.
                                                                                                                          
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&all_conflicts._M_t);
                                                  if (conflicts_with_parents.
                                                                                                            
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(conflicts_with_parents.
                                                                                                                          
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  std::
                                                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                                  ::~vector(&parent_inputs);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&all_children._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&all_parents._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&empty_set._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&all_entries._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&set_78_high._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&set_56_low._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&set_34_cpfp._M_t);
                                                  std::_Rb_tree<$270907ca$>::~_Rb_tree
                                                            (&set_12_normal._M_t);
                                                  if (tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx13.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx12.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx12.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx11.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx11.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx10.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx10.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx9.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx9.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx8.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx8.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx7.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx7.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx6.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx6.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx5.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx5.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx4.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx4.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx3.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx3.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx2.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx2.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  if (tx1.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi !=
                                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  0x0) {
                                                    std::
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                                  _M_release(tx1.
                                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                                  }
                                                  std::unique_lock<std::recursive_mutex>::
                                                  ~unique_lock(&criticalblock2.super_unique_lock);
                                                  std::unique_lock<std::recursive_mutex>::
                                                  ~unique_lock(&criticalblock1.super_unique_lock);
                                                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                                                    return;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(rbf_helper_functions, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(::cs_main, pool.cs);
    TestMemPoolEntryHelper entry;

    const CAmount low_fee{CENT/100};
    const CAmount normal_fee{CENT/10};
    const CAmount high_fee{CENT};

    // Create a parent tx1 and child tx2 with normal fees:
    const auto tx1 = make_tx(/*inputs=*/ {m_coinbase_txns[0]}, /*output_values=*/ {10 * COIN});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx1));
    const auto tx2 = make_tx(/*inputs=*/ {tx1}, /*output_values=*/ {995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx2));

    // Create a low-feerate parent tx3 and high-feerate child tx4 (cpfp)
    const auto tx3 = make_tx(/*inputs=*/ {m_coinbase_txns[1]}, /*output_values=*/ {1099 * CENT});
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx3));
    const auto tx4 = make_tx(/*inputs=*/ {tx3}, /*output_values=*/ {999 * CENT});
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx4));

    // Create a parent tx5 and child tx6 where both have very low fees
    const auto tx5 = make_tx(/*inputs=*/ {m_coinbase_txns[2]}, /*output_values=*/ {1099 * CENT});
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx5));
    const auto tx6 = make_tx(/*inputs=*/ {tx5}, /*output_values=*/ {1098 * CENT});
    pool.addUnchecked(entry.Fee(low_fee).FromTx(tx6));
    // Make tx6's modified fee much higher than its base fee. This should cause it to pass
    // the fee-related checks despite being low-feerate.
    pool.PrioritiseTransaction(tx6->GetHash(), 1 * COIN);

    // Two independent high-feerate transactions, tx7 and tx8
    const auto tx7 = make_tx(/*inputs=*/ {m_coinbase_txns[3]}, /*output_values=*/ {999 * CENT});
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx7));
    const auto tx8 = make_tx(/*inputs=*/ {m_coinbase_txns[4]}, /*output_values=*/ {999 * CENT});
    pool.addUnchecked(entry.Fee(high_fee).FromTx(tx8));

    // Normal txs, will chain txns right before CheckConflictTopology test
    const auto tx9 = make_tx(/*inputs=*/ {m_coinbase_txns[5]}, /*output_values=*/ {995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx9));
    const auto tx10 = make_tx(/*inputs=*/ {m_coinbase_txns[6]}, /*output_values=*/ {995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx10));

    // Will make these two parents of single child
    const auto tx11 = make_tx(/*inputs=*/ {m_coinbase_txns[7]}, /*output_values=*/ {995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx11));
    const auto tx12 = make_tx(/*inputs=*/ {m_coinbase_txns[8]}, /*output_values=*/ {995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx12));

    // Will make two children of this single parent
    const auto tx13 = make_tx(/*inputs=*/ {m_coinbase_txns[9]}, /*output_values=*/ {995 * CENT, 995 * CENT});
    pool.addUnchecked(entry.Fee(normal_fee).FromTx(tx13));

    const auto entry1_normal = pool.GetIter(tx1->GetHash()).value();
    const auto entry2_normal = pool.GetIter(tx2->GetHash()).value();
    const auto entry3_low = pool.GetIter(tx3->GetHash()).value();
    const auto entry4_high = pool.GetIter(tx4->GetHash()).value();
    const auto entry5_low = pool.GetIter(tx5->GetHash()).value();
    const auto entry6_low_prioritised = pool.GetIter(tx6->GetHash()).value();
    const auto entry7_high = pool.GetIter(tx7->GetHash()).value();
    const auto entry8_high = pool.GetIter(tx8->GetHash()).value();
    const auto entry9_unchained = pool.GetIter(tx9->GetHash()).value();
    const auto entry10_unchained = pool.GetIter(tx10->GetHash()).value();
    const auto entry11_unchained = pool.GetIter(tx11->GetHash()).value();
    const auto entry12_unchained = pool.GetIter(tx12->GetHash()).value();
    const auto entry13_unchained = pool.GetIter(tx13->GetHash()).value();

    BOOST_CHECK_EQUAL(entry1_normal->GetFee(), normal_fee);
    BOOST_CHECK_EQUAL(entry2_normal->GetFee(), normal_fee);
    BOOST_CHECK_EQUAL(entry3_low->GetFee(), low_fee);
    BOOST_CHECK_EQUAL(entry4_high->GetFee(), high_fee);
    BOOST_CHECK_EQUAL(entry5_low->GetFee(), low_fee);
    BOOST_CHECK_EQUAL(entry6_low_prioritised->GetFee(), low_fee);
    BOOST_CHECK_EQUAL(entry7_high->GetFee(), high_fee);
    BOOST_CHECK_EQUAL(entry8_high->GetFee(), high_fee);

    CTxMemPool::setEntries set_12_normal{entry1_normal, entry2_normal};
    CTxMemPool::setEntries set_34_cpfp{entry3_low, entry4_high};
    CTxMemPool::setEntries set_56_low{entry5_low, entry6_low_prioritised};
    CTxMemPool::setEntries set_78_high{entry7_high, entry8_high};
    CTxMemPool::setEntries all_entries{entry1_normal, entry2_normal, entry3_low, entry4_high,
                                       entry5_low, entry6_low_prioritised, entry7_high, entry8_high};
    CTxMemPool::setEntries empty_set;

    const auto unused_txid{GetRandHash()};

    // Tests for PaysMoreThanConflicts
    // These tests use feerate, not absolute fee.
    BOOST_CHECK(PaysMoreThanConflicts(/*iters_conflicting=*/set_12_normal,
                                      /*replacement_feerate=*/CFeeRate(entry1_normal->GetModifiedFee() + 1, entry1_normal->GetTxSize() + 2),
                                      /*txid=*/unused_txid).has_value());
    // Replacement must be strictly greater than the originals.
    BOOST_CHECK(PaysMoreThanConflicts(set_12_normal, CFeeRate(entry1_normal->GetModifiedFee(), entry1_normal->GetTxSize()), unused_txid).has_value());
    BOOST_CHECK(PaysMoreThanConflicts(set_12_normal, CFeeRate(entry1_normal->GetModifiedFee() + 1, entry1_normal->GetTxSize()), unused_txid) == std::nullopt);
    // These tests use modified fees (including prioritisation), not base fees.
    BOOST_CHECK(PaysMoreThanConflicts({entry5_low}, CFeeRate(entry5_low->GetModifiedFee() + 1, entry5_low->GetTxSize()), unused_txid) == std::nullopt);
    BOOST_CHECK(PaysMoreThanConflicts({entry6_low_prioritised}, CFeeRate(entry6_low_prioritised->GetFee() + 1, entry6_low_prioritised->GetTxSize()), unused_txid).has_value());
    BOOST_CHECK(PaysMoreThanConflicts({entry6_low_prioritised}, CFeeRate(entry6_low_prioritised->GetModifiedFee() + 1, entry6_low_prioritised->GetTxSize()), unused_txid) == std::nullopt);
    // PaysMoreThanConflicts checks individual feerate, not ancestor feerate. This test compares
    // replacement_feerate and entry4_high's feerate, which are the same. The replacement_feerate is
    // considered too low even though entry4_high has a low ancestor feerate.
    BOOST_CHECK(PaysMoreThanConflicts(set_34_cpfp, CFeeRate(entry4_high->GetModifiedFee(), entry4_high->GetTxSize()), unused_txid).has_value());

    // Tests for EntriesAndTxidsDisjoint
    BOOST_CHECK(EntriesAndTxidsDisjoint(empty_set, {tx1->GetHash()}, unused_txid) == std::nullopt);
    BOOST_CHECK(EntriesAndTxidsDisjoint(set_12_normal, {tx3->GetHash()}, unused_txid) == std::nullopt);
    BOOST_CHECK(EntriesAndTxidsDisjoint({entry2_normal}, {tx2->GetHash()}, unused_txid).has_value());
    BOOST_CHECK(EntriesAndTxidsDisjoint(set_12_normal, {tx1->GetHash()}, unused_txid).has_value());
    BOOST_CHECK(EntriesAndTxidsDisjoint(set_12_normal, {tx2->GetHash()}, unused_txid).has_value());
    // EntriesAndTxidsDisjoint does not calculate descendants of iters_conflicting; it uses whatever
    // the caller passed in. As such, no error is returned even though entry2_normal is a descendant of tx1.
    BOOST_CHECK(EntriesAndTxidsDisjoint({entry2_normal}, {tx1->GetHash()}, unused_txid) == std::nullopt);

    // Tests for PaysForRBF
    const CFeeRate incremental_relay_feerate{DEFAULT_INCREMENTAL_RELAY_FEE};
    const CFeeRate higher_relay_feerate{2 * DEFAULT_INCREMENTAL_RELAY_FEE};
    // Must pay at least as much as the original.
    BOOST_CHECK(PaysForRBF(/*original_fees=*/high_fee,
                           /*replacement_fees=*/high_fee,
                           /*replacement_vsize=*/1,
                           /*relay_fee=*/CFeeRate(0),
                           /*txid=*/unused_txid)
                           == std::nullopt);
    BOOST_CHECK(PaysForRBF(high_fee, high_fee - 1, 1, CFeeRate(0), unused_txid).has_value());
    BOOST_CHECK(PaysForRBF(high_fee + 1, high_fee, 1, CFeeRate(0), unused_txid).has_value());
    // Additional fees must cover the replacement's vsize at incremental relay fee
    BOOST_CHECK(PaysForRBF(high_fee, high_fee + 1, 2, incremental_relay_feerate, unused_txid).has_value());
    BOOST_CHECK(PaysForRBF(high_fee, high_fee + 2, 2, incremental_relay_feerate, unused_txid) == std::nullopt);
    BOOST_CHECK(PaysForRBF(high_fee, high_fee + 2, 2, higher_relay_feerate, unused_txid).has_value());
    BOOST_CHECK(PaysForRBF(high_fee, high_fee + 4, 2, higher_relay_feerate, unused_txid) == std::nullopt);
    BOOST_CHECK(PaysForRBF(low_fee, high_fee, 99999999, incremental_relay_feerate, unused_txid).has_value());
    BOOST_CHECK(PaysForRBF(low_fee, high_fee + 99999999, 99999999, incremental_relay_feerate, unused_txid) == std::nullopt);

    // Tests for GetEntriesForConflicts
    CTxMemPool::setEntries all_parents{entry1_normal, entry3_low, entry5_low, entry7_high, entry8_high};
    CTxMemPool::setEntries all_children{entry2_normal, entry4_high, entry6_low_prioritised};
    const std::vector<CTransactionRef> parent_inputs({m_coinbase_txns[0], m_coinbase_txns[1], m_coinbase_txns[2],
                                                m_coinbase_txns[3], m_coinbase_txns[4]});
    const auto conflicts_with_parents = make_tx(parent_inputs, {50 * CENT});
    CTxMemPool::setEntries all_conflicts;
    BOOST_CHECK(GetEntriesForConflicts(/*tx=*/ *conflicts_with_parents.get(),
                                       /*pool=*/ pool,
                                       /*iters_conflicting=*/ all_parents,
                                       /*all_conflicts=*/ all_conflicts) == std::nullopt);
    BOOST_CHECK(all_conflicts == all_entries);
    auto conflicts_size = all_conflicts.size();
    all_conflicts.clear();

    add_descendants(tx2, 23, pool);
    BOOST_CHECK(GetEntriesForConflicts(*conflicts_with_parents.get(), pool, all_parents, all_conflicts) == std::nullopt);
    conflicts_size += 23;
    BOOST_CHECK_EQUAL(all_conflicts.size(), conflicts_size);
    all_conflicts.clear();

    add_descendants(tx4, 23, pool);
    BOOST_CHECK(GetEntriesForConflicts(*conflicts_with_parents.get(), pool, all_parents, all_conflicts) == std::nullopt);
    conflicts_size += 23;
    BOOST_CHECK_EQUAL(all_conflicts.size(), conflicts_size);
    all_conflicts.clear();

    add_descendants(tx6, 23, pool);
    BOOST_CHECK(GetEntriesForConflicts(*conflicts_with_parents.get(), pool, all_parents, all_conflicts) == std::nullopt);
    conflicts_size += 23;
    BOOST_CHECK_EQUAL(all_conflicts.size(), conflicts_size);
    all_conflicts.clear();

    add_descendants(tx7, 23, pool);
    BOOST_CHECK(GetEntriesForConflicts(*conflicts_with_parents.get(), pool, all_parents, all_conflicts) == std::nullopt);
    conflicts_size += 23;
    BOOST_CHECK_EQUAL(all_conflicts.size(), conflicts_size);
    BOOST_CHECK_EQUAL(all_conflicts.size(), 100);
    all_conflicts.clear();

    // Exceeds maximum number of conflicts.
    add_descendants(tx8, 1, pool);
    BOOST_CHECK(GetEntriesForConflicts(*conflicts_with_parents.get(), pool, all_parents, all_conflicts).has_value());

    // Tests for HasNoNewUnconfirmed
    const auto spends_unconfirmed = make_tx({tx1}, {36 * CENT});
    for (const auto& input : spends_unconfirmed->vin) {
        // Spends unconfirmed inputs.
        BOOST_CHECK(pool.exists(GenTxid::Txid(input.prevout.hash)));
    }
    BOOST_CHECK(HasNoNewUnconfirmed(/*tx=*/ *spends_unconfirmed.get(),
                                    /*pool=*/ pool,
                                    /*iters_conflicting=*/ all_entries) == std::nullopt);
    BOOST_CHECK(HasNoNewUnconfirmed(*spends_unconfirmed.get(), pool, {entry2_normal}) == std::nullopt);
    BOOST_CHECK(HasNoNewUnconfirmed(*spends_unconfirmed.get(), pool, empty_set).has_value());

    const auto spends_new_unconfirmed = make_tx({tx1, tx8}, {36 * CENT});
    BOOST_CHECK(HasNoNewUnconfirmed(*spends_new_unconfirmed.get(), pool, {entry2_normal}).has_value());
    BOOST_CHECK(HasNoNewUnconfirmed(*spends_new_unconfirmed.get(), pool, all_entries).has_value());

    const auto spends_conflicting_confirmed = make_tx({m_coinbase_txns[0], m_coinbase_txns[1]}, {45 * CENT});
    BOOST_CHECK(HasNoNewUnconfirmed(*spends_conflicting_confirmed.get(), pool, {entry1_normal, entry3_low}) == std::nullopt);

    // Tests for CheckConflictTopology

    // Tx4 has 23 descendants
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology(set_34_cpfp).value(), strprintf("%s has 23 descendants, max 1 allowed", entry4_high->GetSharedTx()->GetHash().ToString()));

    // No descendants yet
    BOOST_CHECK(pool.CheckConflictTopology({entry9_unchained}) == std::nullopt);

    // Add 1 descendant, still ok
    add_descendants(tx9, 1, pool);
    BOOST_CHECK(pool.CheckConflictTopology({entry9_unchained}) == std::nullopt);

    // N direct conflicts; ok
    BOOST_CHECK(pool.CheckConflictTopology({entry9_unchained, entry10_unchained, entry11_unchained}) == std::nullopt);

    // Add 1 descendant, still ok, even if it's considered a direct conflict as well
    const auto child_tx = add_descendants(tx10, 1, pool);
    const auto entry10_child = pool.GetIter(child_tx->GetHash()).value();
    BOOST_CHECK(pool.CheckConflictTopology({entry9_unchained, entry10_unchained, entry11_unchained}) == std::nullopt);
    BOOST_CHECK(pool.CheckConflictTopology({entry9_unchained, entry10_unchained, entry11_unchained, entry10_child}) == std::nullopt);

    // One more, size 3 cluster too much
    const auto grand_child_tx = add_descendants(child_tx, 1, pool);
    const auto entry10_grand_child = pool.GetIter(grand_child_tx->GetHash()).value();
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry9_unchained, entry10_unchained, entry11_unchained}).value(), strprintf("%s has 2 descendants, max 1 allowed", entry10_unchained->GetSharedTx()->GetHash().ToString()));
    // even if direct conflict is descendent itself
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry9_unchained, entry10_grand_child, entry11_unchained}).value(), strprintf("%s has 2 ancestors, max 1 allowed", entry10_grand_child->GetSharedTx()->GetHash().ToString()));

    // Make a single child from two singleton parents
    const auto two_parent_child_tx = add_descendant_to_parents({tx11, tx12}, pool);
    const auto entry_two_parent_child = pool.GetIter(two_parent_child_tx->GetHash()).value();
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry11_unchained}).value(), strprintf("%s is not the only parent of child %s", entry11_unchained->GetSharedTx()->GetHash().ToString(), entry_two_parent_child->GetSharedTx()->GetHash().ToString()));
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry12_unchained}).value(), strprintf("%s is not the only parent of child %s", entry12_unchained->GetSharedTx()->GetHash().ToString(), entry_two_parent_child->GetSharedTx()->GetHash().ToString()));
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry_two_parent_child}).value(), strprintf("%s has 2 ancestors, max 1 allowed", entry_two_parent_child->GetSharedTx()->GetHash().ToString()));

    // Single parent with two children, we will conflict with the siblings directly only
    const auto two_siblings = add_children_to_parent(tx13, pool);
    const auto entry_sibling_1 = pool.GetIter(two_siblings.first->GetHash()).value();
    const auto entry_sibling_2 = pool.GetIter(two_siblings.second->GetHash()).value();
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry_sibling_1}).value(), strprintf("%s is not the only child of parent %s", entry_sibling_1->GetSharedTx()->GetHash().ToString(), entry13_unchained->GetSharedTx()->GetHash().ToString()));
    BOOST_CHECK_EQUAL(pool.CheckConflictTopology({entry_sibling_2}).value(), strprintf("%s is not the only child of parent %s", entry_sibling_2->GetSharedTx()->GetHash().ToString(), entry13_unchained->GetSharedTx()->GetHash().ToString()));

}